

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [12];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  byte bVar54;
  byte bVar55;
  byte bVar56;
  ulong uVar57;
  byte bVar58;
  byte bVar59;
  uint uVar60;
  uint uVar61;
  int iVar62;
  byte bVar63;
  bool bVar64;
  long lVar65;
  undefined1 uVar66;
  bool bVar67;
  undefined1 uVar68;
  ulong uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar137;
  uint uVar138;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  uint uVar140;
  uint uVar141;
  uint uVar142;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  uint uVar139;
  uint uVar143;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar144;
  float fVar162;
  vint4 bi_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar163;
  undefined4 uVar164;
  float fVar179;
  float fVar180;
  vint4 bi_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar175 [32];
  undefined1 auVar168 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar186;
  vint4 bi;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [32];
  undefined1 auVar223 [16];
  undefined1 auVar230 [32];
  undefined1 auVar228 [16];
  undefined1 auVar231 [32];
  vint4 ai_2;
  undefined1 auVar239 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  vint4 ai_1;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  vint4 ai;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [28];
  undefined1 auVar270 [32];
  float fVar271;
  undefined1 auVar272 [16];
  undefined1 auVar273 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  Primitive *local_6b0;
  ulong local_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  RTCHitN local_400 [32];
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar2 = prim[1];
  uVar57 = (ulong)(byte)PVar2;
  lVar25 = uVar57 * 0x25;
  fVar144 = *(float *)(prim + lVar25 + 0x12);
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar76 = vsubps_avx(auVar76,*(undefined1 (*) [16])(prim + lVar25 + 6));
  auVar216._0_4_ = fVar144 * auVar76._0_4_;
  auVar216._4_4_ = fVar144 * auVar76._4_4_;
  auVar216._8_4_ = fVar144 * auVar76._8_4_;
  auVar216._12_4_ = fVar144 * auVar76._12_4_;
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 4 + 6)));
  auVar145._0_4_ = fVar144 * auVar75._0_4_;
  auVar145._4_4_ = fVar144 * auVar75._4_4_;
  auVar145._8_4_ = fVar144 * auVar75._8_4_;
  auVar145._12_4_ = fVar144 * auVar75._12_4_;
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 5 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 6 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0xf + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar57 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0x1a + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0x1b + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0x1c + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar245._4_4_ = auVar145._0_4_;
  auVar245._0_4_ = auVar145._0_4_;
  auVar245._8_4_ = auVar145._0_4_;
  auVar245._12_4_ = auVar145._0_4_;
  auVar83 = vshufps_avx(auVar145,auVar145,0x55);
  auVar85 = vshufps_avx(auVar145,auVar145,0xaa);
  fVar144 = auVar85._0_4_;
  auVar187._0_4_ = fVar144 * auVar78._0_4_;
  fVar162 = auVar85._4_4_;
  auVar187._4_4_ = fVar162 * auVar78._4_4_;
  fVar163 = auVar85._8_4_;
  auVar187._8_4_ = fVar163 * auVar78._8_4_;
  fVar179 = auVar85._12_4_;
  auVar187._12_4_ = fVar179 * auVar78._12_4_;
  auVar165._0_4_ = auVar80._0_4_ * fVar144;
  auVar165._4_4_ = auVar80._4_4_ * fVar162;
  auVar165._8_4_ = auVar80._8_4_ * fVar163;
  auVar165._12_4_ = auVar80._12_4_ * fVar179;
  auVar146._0_4_ = auVar82._0_4_ * fVar144;
  auVar146._4_4_ = auVar82._4_4_ * fVar162;
  auVar146._8_4_ = auVar82._8_4_ * fVar163;
  auVar146._12_4_ = auVar82._12_4_ * fVar179;
  auVar85 = vfmadd231ps_fma(auVar187,auVar83,auVar75);
  auVar86 = vfmadd231ps_fma(auVar165,auVar83,auVar17);
  auVar83 = vfmadd231ps_fma(auVar146,auVar77,auVar83);
  auVar84 = vfmadd231ps_fma(auVar85,auVar245,auVar76);
  auVar86 = vfmadd231ps_fma(auVar86,auVar245,auVar79);
  auVar87 = vfmadd231ps_fma(auVar83,auVar81,auVar245);
  auVar272._4_4_ = auVar216._0_4_;
  auVar272._0_4_ = auVar216._0_4_;
  auVar272._8_4_ = auVar216._0_4_;
  auVar272._12_4_ = auVar216._0_4_;
  auVar83 = vshufps_avx(auVar216,auVar216,0x55);
  auVar85 = vshufps_avx(auVar216,auVar216,0xaa);
  fVar144 = auVar85._0_4_;
  auVar246._0_4_ = fVar144 * auVar78._0_4_;
  fVar162 = auVar85._4_4_;
  auVar246._4_4_ = fVar162 * auVar78._4_4_;
  fVar163 = auVar85._8_4_;
  auVar246._8_4_ = fVar163 * auVar78._8_4_;
  fVar179 = auVar85._12_4_;
  auVar246._12_4_ = fVar179 * auVar78._12_4_;
  auVar232._0_4_ = auVar80._0_4_ * fVar144;
  auVar232._4_4_ = auVar80._4_4_ * fVar162;
  auVar232._8_4_ = auVar80._8_4_ * fVar163;
  auVar232._12_4_ = auVar80._12_4_ * fVar179;
  auVar217._0_4_ = auVar82._0_4_ * fVar144;
  auVar217._4_4_ = auVar82._4_4_ * fVar162;
  auVar217._8_4_ = auVar82._8_4_ * fVar163;
  auVar217._12_4_ = auVar82._12_4_ * fVar179;
  auVar75 = vfmadd231ps_fma(auVar246,auVar83,auVar75);
  auVar78 = vfmadd231ps_fma(auVar232,auVar83,auVar17);
  auVar17 = vfmadd231ps_fma(auVar217,auVar83,auVar77);
  auVar26 = vfmadd231ps_fma(auVar75,auVar272,auVar76);
  auVar145 = vfmadd231ps_fma(auVar78,auVar272,auVar79);
  auVar268._8_4_ = 0x7fffffff;
  auVar268._0_8_ = 0x7fffffff7fffffff;
  auVar268._12_4_ = 0x7fffffff;
  auVar146 = vfmadd231ps_fma(auVar17,auVar272,auVar81);
  auVar76 = vandps_avx(auVar268,auVar84);
  auVar263._8_4_ = 0x219392ef;
  auVar263._0_8_ = 0x219392ef219392ef;
  auVar263._12_4_ = 0x219392ef;
  uVar69 = vcmpps_avx512vl(auVar76,auVar263,1);
  bVar64 = (bool)((byte)uVar69 & 1);
  auVar72._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar84._0_4_;
  bVar64 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar84._4_4_;
  bVar64 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar84._8_4_;
  bVar64 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar84._12_4_;
  auVar76 = vandps_avx(auVar268,auVar86);
  uVar69 = vcmpps_avx512vl(auVar76,auVar263,1);
  bVar64 = (bool)((byte)uVar69 & 1);
  auVar73._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar86._0_4_;
  bVar64 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar86._4_4_;
  bVar64 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar86._8_4_;
  bVar64 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar86._12_4_;
  auVar76 = vandps_avx(auVar268,auVar87);
  uVar69 = vcmpps_avx512vl(auVar76,auVar263,1);
  bVar64 = (bool)((byte)uVar69 & 1);
  auVar74._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar87._0_4_;
  bVar64 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar87._4_4_;
  bVar64 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar87._8_4_;
  bVar64 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar87._12_4_;
  auVar75 = vrcp14ps_avx512vl(auVar72);
  auVar264._8_4_ = 0x3f800000;
  auVar264._0_8_ = 0x3f8000003f800000;
  auVar264._12_4_ = 0x3f800000;
  auVar76 = vfnmadd213ps_fma(auVar72,auVar75,auVar264);
  auVar84 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar73);
  auVar76 = vfnmadd213ps_fma(auVar73,auVar75,auVar264);
  auVar87 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar74);
  auVar76 = vfnmadd213ps_fma(auVar74,auVar75,auVar264);
  auVar88 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  fVar144 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar256._4_4_ = fVar144;
  auVar256._0_4_ = fVar144;
  auVar256._8_4_ = fVar144;
  auVar256._12_4_ = fVar144;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar57 * 7 + 6);
  auVar76 = vpmovsxwd_avx(auVar76);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar57 * 0xb + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar79 = vsubps_avx(auVar75,auVar76);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar57 * 9 + 6);
  auVar75 = vpmovsxwd_avx(auVar78);
  auVar78 = vfmadd213ps_fma(auVar79,auVar256,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar75);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar57 * 0xd + 6);
  auVar75 = vpmovsxwd_avx(auVar79);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar79 = vfmadd213ps_fma(auVar75,auVar256,auVar76);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar57 * 0x12 + 6);
  auVar76 = vpmovsxwd_avx(auVar17);
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar69 = (ulong)(uint)((int)(uVar57 * 5) << 2);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar57 * 2 + uVar69 + 6);
  auVar75 = vpmovsxwd_avx(auVar80);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar17 = vfmadd213ps_fma(auVar75,auVar256,auVar76);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar76 = vpmovsxwd_avx(auVar81);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar57 * 0x18 + 6);
  auVar75 = vpmovsxwd_avx(auVar77);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar80 = vfmadd213ps_fma(auVar75,auVar256,auVar76);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar57 * 0x1d + 6);
  auVar76 = vpmovsxwd_avx(auVar82);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar57 + (ulong)(byte)PVar2 * 0x20 + 6);
  auVar75 = vpmovsxwd_avx(auVar83);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar81 = vfmadd213ps_fma(auVar75,auVar256,auVar76);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar2 * 0x20 - uVar57) + 6);
  auVar76 = vpmovsxwd_avx(auVar85);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar57 * 0x23 + 6);
  auVar75 = vpmovsxwd_avx(auVar86);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar75 = vfmadd213ps_fma(auVar75,auVar256,auVar76);
  auVar76 = vsubps_avx(auVar78,auVar26);
  auVar257._0_4_ = auVar84._0_4_ * auVar76._0_4_;
  auVar257._4_4_ = auVar84._4_4_ * auVar76._4_4_;
  auVar257._8_4_ = auVar84._8_4_ * auVar76._8_4_;
  auVar257._12_4_ = auVar84._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar79,auVar26);
  auVar188._0_4_ = auVar84._0_4_ * auVar76._0_4_;
  auVar188._4_4_ = auVar84._4_4_ * auVar76._4_4_;
  auVar188._8_4_ = auVar84._8_4_ * auVar76._8_4_;
  auVar188._12_4_ = auVar84._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar17,auVar145);
  auVar247._0_4_ = auVar87._0_4_ * auVar76._0_4_;
  auVar247._4_4_ = auVar87._4_4_ * auVar76._4_4_;
  auVar247._8_4_ = auVar87._8_4_ * auVar76._8_4_;
  auVar247._12_4_ = auVar87._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar80,auVar145);
  auVar166._0_4_ = auVar87._0_4_ * auVar76._0_4_;
  auVar166._4_4_ = auVar87._4_4_ * auVar76._4_4_;
  auVar166._8_4_ = auVar87._8_4_ * auVar76._8_4_;
  auVar166._12_4_ = auVar87._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar81,auVar146);
  auVar233._0_4_ = auVar88._0_4_ * auVar76._0_4_;
  auVar233._4_4_ = auVar88._4_4_ * auVar76._4_4_;
  auVar233._8_4_ = auVar88._8_4_ * auVar76._8_4_;
  auVar233._12_4_ = auVar88._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar75,auVar146);
  auVar147._0_4_ = auVar88._0_4_ * auVar76._0_4_;
  auVar147._4_4_ = auVar88._4_4_ * auVar76._4_4_;
  auVar147._8_4_ = auVar88._8_4_ * auVar76._8_4_;
  auVar147._12_4_ = auVar88._12_4_ * auVar76._12_4_;
  auVar76 = vpminsd_avx(auVar257,auVar188);
  auVar75 = vpminsd_avx(auVar247,auVar166);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar75 = vpminsd_avx(auVar233,auVar147);
  uVar164 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar84._4_4_ = uVar164;
  auVar84._0_4_ = uVar164;
  auVar84._8_4_ = uVar164;
  auVar84._12_4_ = uVar164;
  auVar75 = vmaxps_avx512vl(auVar75,auVar84);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar87._8_4_ = 0x3f7ffffa;
  auVar87._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar87._12_4_ = 0x3f7ffffa;
  local_4a0 = vmulps_avx512vl(auVar76,auVar87);
  auVar76 = vpmaxsd_avx(auVar257,auVar188);
  auVar75 = vpmaxsd_avx(auVar247,auVar166);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar75 = vpmaxsd_avx(auVar233,auVar147);
  uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar88._4_4_ = uVar164;
  auVar88._0_4_ = uVar164;
  auVar88._8_4_ = uVar164;
  auVar88._12_4_ = uVar164;
  auVar75 = vminps_avx512vl(auVar75,auVar88);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar26._8_4_ = 0x3f800003;
  auVar26._0_8_ = 0x3f8000033f800003;
  auVar26._12_4_ = 0x3f800003;
  auVar76 = vmulps_avx512vl(auVar76,auVar26);
  auVar75 = vpbroadcastd_avx512vl();
  uVar21 = vcmpps_avx512vl(local_4a0,auVar76,2);
  local_6a8 = vpcmpgtd_avx512vl(auVar75,_DAT_01f7fcf0);
  local_6a8 = ((byte)uVar21 & 0xf) & local_6a8;
  if ((char)local_6a8 == '\0') {
    return false;
  }
  local_480 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6b0 = prim;
LAB_01b6ee20:
  lVar25 = 0;
  for (uVar69 = local_6a8; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar60 = *(uint *)(local_6b0 + 2);
  pGVar3 = (context->scene->geometries).items[uVar60].ptr;
  uVar69 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(local_6b0 + lVar25 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar144 = (pGVar3->time_range).lower;
  fVar144 = pGVar3->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar144) / ((pGVar3->time_range).upper - fVar144));
  auVar76 = vroundss_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),9);
  auVar76 = vminss_avx(auVar76,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar76 = vmaxss_avx(ZEXT816(0) << 0x20,auVar76);
  fVar144 = fVar144 - auVar76._0_4_;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar65 = (long)(int)auVar76._0_4_ * 0x38;
  lVar25 = *(long *)(_Var4 + 0x10 + lVar65);
  lVar5 = *(long *)(_Var4 + 0x38 + lVar65);
  lVar6 = *(long *)(_Var4 + 0x48 + lVar65);
  pfVar1 = (float *)(lVar5 + uVar69 * lVar6);
  auVar148._0_4_ = fVar144 * *pfVar1;
  auVar148._4_4_ = fVar144 * pfVar1[1];
  auVar148._8_4_ = fVar144 * pfVar1[2];
  auVar148._12_4_ = fVar144 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar69 + 1) * lVar6);
  auVar167._0_4_ = fVar144 * *pfVar1;
  auVar167._4_4_ = fVar144 * pfVar1[1];
  auVar167._8_4_ = fVar144 * pfVar1[2];
  auVar167._12_4_ = fVar144 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar69 + 2) * lVar6);
  auVar189._0_4_ = fVar144 * *pfVar1;
  auVar189._4_4_ = fVar144 * pfVar1[1];
  auVar189._8_4_ = fVar144 * pfVar1[2];
  auVar189._12_4_ = fVar144 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + lVar6 * (uVar69 + 3));
  auVar218._0_4_ = fVar144 * *pfVar1;
  auVar218._4_4_ = fVar144 * pfVar1[1];
  auVar218._8_4_ = fVar144 * pfVar1[2];
  auVar218._12_4_ = fVar144 * pfVar1[3];
  lVar5 = *(long *)(_Var4 + lVar65);
  fVar144 = 1.0 - fVar144;
  auVar234._4_4_ = fVar144;
  auVar234._0_4_ = fVar144;
  auVar234._8_4_ = fVar144;
  auVar234._12_4_ = fVar144;
  auVar78 = vfmadd231ps_fma(auVar148,auVar234,*(undefined1 (*) [16])(lVar5 + lVar25 * uVar69));
  auVar79 = vfmadd231ps_fma(auVar167,auVar234,*(undefined1 (*) [16])(lVar5 + lVar25 * (uVar69 + 1)))
  ;
  auVar17 = vfmadd231ps_fma(auVar189,auVar234,*(undefined1 (*) [16])(lVar5 + lVar25 * (uVar69 + 2)))
  ;
  auVar80 = vfmadd231ps_fma(auVar218,auVar234,*(undefined1 (*) [16])(lVar5 + lVar25 * (uVar69 + 3)))
  ;
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar75 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  _local_500 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_520 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar76 = vunpcklps_avx512vl(local_500._0_16_,local_520._0_16_);
  local_540 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar82 = local_540._0_16_;
  local_790 = vinsertps_avx512f(auVar76,auVar82,0x28);
  auVar248._0_4_ = auVar78._0_4_ + auVar79._0_4_ + auVar17._0_4_ + auVar80._0_4_;
  auVar248._4_4_ = auVar78._4_4_ + auVar79._4_4_ + auVar17._4_4_ + auVar80._4_4_;
  auVar248._8_4_ = auVar78._8_4_ + auVar79._8_4_ + auVar17._8_4_ + auVar80._8_4_;
  auVar248._12_4_ = auVar78._12_4_ + auVar79._12_4_ + auVar17._12_4_ + auVar80._12_4_;
  auVar27._8_4_ = 0x3e800000;
  auVar27._0_8_ = 0x3e8000003e800000;
  auVar27._12_4_ = 0x3e800000;
  auVar76 = vmulps_avx512vl(auVar248,auVar27);
  auVar76 = vsubps_avx(auVar76,auVar75);
  auVar76 = vdpps_avx(auVar76,local_790,0x7f);
  fVar144 = *(float *)(ray + k * 4 + 0x60);
  local_7a0 = vdpps_avx(local_790,local_790,0x7f);
  local_420 = vpbroadcastd_avx512vl();
  auVar258._4_12_ = ZEXT812(0) << 0x20;
  auVar258._0_4_ = local_7a0._0_4_;
  auVar77 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar258);
  auVar81 = vfnmadd213ss_fma(auVar77,local_7a0,ZEXT416(0x40000000));
  fVar162 = auVar76._0_4_ * auVar77._0_4_ * auVar81._0_4_;
  auVar259._4_4_ = fVar162;
  auVar259._0_4_ = fVar162;
  auVar259._8_4_ = fVar162;
  auVar259._12_4_ = fVar162;
  auVar76 = vfmadd231ps_fma(auVar75,local_790,auVar259);
  auVar76 = vblendps_avx(auVar76,ZEXT816(0) << 0x40,8);
  auVar75 = vsubps_avx(auVar78,auVar76);
  auVar78 = vsubps_avx(auVar17,auVar76);
  auVar79 = vsubps_avx(auVar79,auVar76);
  auVar76 = vsubps_avx(auVar80,auVar76);
  auVar89 = vbroadcastss_avx512vl(auVar75);
  auVar273 = ZEXT3264(auVar89);
  auVar97._8_4_ = 1;
  auVar97._0_8_ = 0x100000001;
  auVar97._12_4_ = 1;
  auVar97._16_4_ = 1;
  auVar97._20_4_ = 1;
  auVar97._24_4_ = 1;
  auVar97._28_4_ = 1;
  local_620 = ZEXT1632(auVar75);
  auVar89 = vpermps_avx2(auVar97,local_620);
  auVar98._8_4_ = 2;
  auVar98._0_8_ = 0x200000002;
  auVar98._12_4_ = 2;
  auVar98._16_4_ = 2;
  auVar98._20_4_ = 2;
  auVar98._24_4_ = 2;
  auVar98._28_4_ = 2;
  auVar18 = vpermps_avx2(auVar98,local_620);
  auVar99._8_4_ = 3;
  auVar99._0_8_ = 0x300000003;
  auVar99._12_4_ = 3;
  auVar99._16_4_ = 3;
  auVar99._20_4_ = 3;
  auVar99._24_4_ = 3;
  auVar99._28_4_ = 3;
  auVar90 = vpermps_avx512vl(auVar99,local_620);
  uVar164 = auVar79._0_4_;
  local_6a0._4_4_ = uVar164;
  local_6a0._0_4_ = uVar164;
  local_6a0._8_4_ = uVar164;
  local_6a0._12_4_ = uVar164;
  local_6a0._16_4_ = uVar164;
  local_6a0._20_4_ = uVar164;
  local_6a0._24_4_ = uVar164;
  local_6a0._28_4_ = uVar164;
  auVar243 = ZEXT3264(local_6a0);
  local_660 = ZEXT1632(auVar79);
  auVar19 = vpermps_avx2(auVar97,local_660);
  auVar20 = vpermps_avx2(auVar98,local_660);
  auVar91 = vpermps_avx512vl(auVar99,local_660);
  auVar92 = vbroadcastss_avx512vl(auVar78);
  local_640 = ZEXT1632(auVar78);
  auVar93 = vpermps_avx512vl(auVar97,local_640);
  auVar94 = vpermps_avx512vl(auVar98,local_640);
  auVar95 = vpermps_avx512vl(auVar99,local_640);
  auVar96 = vbroadcastss_avx512vl(auVar76);
  _local_680 = ZEXT1632(auVar76);
  auVar97 = vpermps_avx512vl(auVar97,_local_680);
  auVar98 = vpermps_avx512vl(auVar98,_local_680);
  auVar99 = vpermps_avx512vl(auVar99,_local_680);
  auVar76 = vmulss_avx512f(auVar82,auVar82);
  auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),local_520,local_520);
  local_240 = vfmadd231ps_avx512vl(auVar100,_local_500,_local_500);
  local_220._0_4_ = local_240._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar100._8_4_ = 0x7fffffff;
  auVar100._0_8_ = 0x7fffffff7fffffff;
  auVar100._12_4_ = 0x7fffffff;
  auVar100._16_4_ = 0x7fffffff;
  auVar100._20_4_ = 0x7fffffff;
  auVar100._24_4_ = 0x7fffffff;
  auVar100._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar100);
  local_710 = ZEXT416((uint)fVar162);
  local_260 = fVar144 - fVar162;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  uVar61 = 0;
  bVar64 = false;
  iVar62 = 1;
  local_440 = vpbroadcastd_avx512vl();
  auVar76 = vsqrtss_avx(local_7a0,local_7a0);
  auVar75 = vsqrtss_avx(local_7a0,local_7a0);
  local_490 = ZEXT816(0x3f80000000000000);
  do {
    auVar78 = vmovshdup_avx(local_490);
    auVar78 = vsubps_avx(auVar78,local_490);
    fVar163 = auVar78._0_4_;
    fVar183 = fVar163 * 0.04761905;
    auVar229._0_4_ = local_490._0_4_;
    auVar229._4_4_ = auVar229._0_4_;
    auVar229._8_4_ = auVar229._0_4_;
    auVar229._12_4_ = auVar229._0_4_;
    auVar229._16_4_ = auVar229._0_4_;
    auVar229._20_4_ = auVar229._0_4_;
    auVar229._24_4_ = auVar229._0_4_;
    auVar229._28_4_ = auVar229._0_4_;
    auVar253._4_4_ = fVar163;
    auVar253._0_4_ = fVar163;
    auVar253._8_4_ = fVar163;
    auVar253._12_4_ = fVar163;
    auVar253._16_4_ = fVar163;
    auVar253._20_4_ = fVar163;
    auVar253._24_4_ = fVar163;
    auVar253._28_4_ = fVar163;
    auVar78 = vfmadd231ps_fma(auVar229,auVar253,_DAT_01faff20);
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar100 = vsubps_avx512vl(auVar101,ZEXT1632(auVar78));
    fVar163 = auVar78._0_4_;
    fVar179 = auVar78._4_4_;
    auVar116._4_4_ = auVar243._4_4_ * fVar179;
    auVar116._0_4_ = auVar243._0_4_ * fVar163;
    fVar180 = auVar78._8_4_;
    auVar116._8_4_ = auVar243._8_4_ * fVar180;
    fVar181 = auVar78._12_4_;
    auVar116._12_4_ = auVar243._12_4_ * fVar181;
    auVar116._16_4_ = auVar243._16_4_ * 0.0;
    auVar116._20_4_ = auVar243._20_4_ * 0.0;
    auVar116._24_4_ = auVar243._24_4_ * 0.0;
    auVar116._28_4_ = DAT_01faff20._28_4_;
    auVar104._4_4_ = auVar19._4_4_ * fVar179;
    auVar104._0_4_ = auVar19._0_4_ * fVar163;
    auVar104._8_4_ = auVar19._8_4_ * fVar180;
    auVar104._12_4_ = auVar19._12_4_ * fVar181;
    auVar104._16_4_ = auVar19._16_4_ * 0.0;
    auVar104._20_4_ = auVar19._20_4_ * 0.0;
    auVar104._24_4_ = auVar19._24_4_ * 0.0;
    auVar104._28_4_ = auVar229._0_4_;
    auVar244._0_4_ = auVar20._0_4_ * fVar163;
    auVar244._4_4_ = auVar20._4_4_ * fVar179;
    auVar244._8_4_ = auVar20._8_4_ * fVar180;
    auVar244._12_4_ = auVar20._12_4_ * fVar181;
    auVar244._16_4_ = auVar20._16_4_ * 0.0;
    auVar244._20_4_ = auVar20._20_4_ * 0.0;
    auVar244._28_36_ = auVar243._28_36_;
    auVar244._24_4_ = auVar20._24_4_ * 0.0;
    auVar102 = vmulps_avx512vl(auVar91,ZEXT1632(auVar78));
    local_7e0 = auVar273._0_32_;
    auVar103 = vfmadd231ps_avx512vl(auVar116,auVar100,local_7e0);
    auVar79 = vfmadd231ps_fma(auVar104,auVar100,auVar89);
    auVar17 = vfmadd231ps_fma(auVar244._0_32_,auVar100,auVar18);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,auVar90);
    auVar104 = vmulps_avx512vl(auVar92,ZEXT1632(auVar78));
    auVar111 = ZEXT1632(auVar78);
    auVar105 = vmulps_avx512vl(auVar93,auVar111);
    auVar106 = vmulps_avx512vl(auVar94,auVar111);
    auVar107 = vmulps_avx512vl(auVar95,auVar111);
    auVar80 = vfmadd231ps_fma(auVar104,auVar100,auVar243._0_32_);
    auVar81 = vfmadd231ps_fma(auVar105,auVar100,auVar19);
    auVar77 = vfmadd231ps_fma(auVar106,auVar100,auVar20);
    auVar104 = vfmadd231ps_avx512vl(auVar107,auVar100,auVar91);
    auVar105 = vmulps_avx512vl(auVar96,auVar111);
    auVar106 = vmulps_avx512vl(auVar97,auVar111);
    auVar107 = vmulps_avx512vl(auVar98,auVar111);
    auVar108 = vmulps_avx512vl(auVar99,auVar111);
    auVar109 = vfmadd231ps_avx512vl(auVar105,auVar100,auVar92);
    auVar110 = vfmadd231ps_avx512vl(auVar106,auVar100,auVar93);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar100,auVar94);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar100,auVar95);
    auVar117._28_4_ = auVar20._28_4_;
    auVar117._0_28_ =
         ZEXT1628(CONCAT412(fVar181 * auVar80._12_4_,
                            CONCAT48(fVar180 * auVar80._8_4_,
                                     CONCAT44(fVar179 * auVar80._4_4_,fVar163 * auVar80._0_4_))));
    auVar105 = vmulps_avx512vl(auVar111,ZEXT1632(auVar81));
    auVar106 = vmulps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar77));
    auVar111 = vmulps_avx512vl(ZEXT1632(auVar78),auVar104);
    auVar78 = vfmadd231ps_fma(auVar117,auVar100,auVar103);
    auVar112 = vfmadd231ps_avx512vl(auVar105,auVar100,ZEXT1632(auVar79));
    auVar113 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar17));
    auVar114 = vfmadd231ps_avx512vl(auVar111,auVar100,auVar102);
    auVar105._4_4_ = auVar109._4_4_ * fVar179;
    auVar105._0_4_ = auVar109._0_4_ * fVar163;
    auVar105._8_4_ = auVar109._8_4_ * fVar180;
    auVar105._12_4_ = auVar109._12_4_ * fVar181;
    auVar105._16_4_ = auVar109._16_4_ * 0.0;
    auVar105._20_4_ = auVar109._20_4_ * 0.0;
    auVar105._24_4_ = auVar109._24_4_ * 0.0;
    auVar105._28_4_ = auVar102._28_4_;
    auVar106._4_4_ = auVar110._4_4_ * fVar179;
    auVar106._0_4_ = auVar110._0_4_ * fVar163;
    auVar106._8_4_ = auVar110._8_4_ * fVar180;
    auVar106._12_4_ = auVar110._12_4_ * fVar181;
    auVar106._16_4_ = auVar110._16_4_ * 0.0;
    auVar106._20_4_ = auVar110._20_4_ * 0.0;
    auVar106._24_4_ = auVar110._24_4_ * 0.0;
    auVar106._28_4_ = auVar109._28_4_;
    auVar111._4_4_ = auVar107._4_4_ * fVar179;
    auVar111._0_4_ = auVar107._0_4_ * fVar163;
    auVar111._8_4_ = auVar107._8_4_ * fVar180;
    auVar111._12_4_ = auVar107._12_4_ * fVar181;
    auVar111._16_4_ = auVar107._16_4_ * 0.0;
    auVar111._20_4_ = auVar107._20_4_ * 0.0;
    auVar111._24_4_ = auVar107._24_4_ * 0.0;
    auVar111._28_4_ = auVar110._28_4_;
    auVar110._4_4_ = auVar108._4_4_ * fVar179;
    auVar110._0_4_ = auVar108._0_4_ * fVar163;
    auVar110._8_4_ = auVar108._8_4_ * fVar180;
    auVar110._12_4_ = auVar108._12_4_ * fVar181;
    auVar110._16_4_ = auVar108._16_4_ * 0.0;
    auVar110._20_4_ = auVar108._20_4_ * 0.0;
    auVar110._24_4_ = auVar108._24_4_ * 0.0;
    auVar110._28_4_ = auVar107._28_4_;
    auVar79 = vfmadd231ps_fma(auVar105,auVar100,ZEXT1632(auVar80));
    auVar17 = vfmadd231ps_fma(auVar106,auVar100,ZEXT1632(auVar81));
    auVar80 = vfmadd231ps_fma(auVar111,auVar100,ZEXT1632(auVar77));
    auVar81 = vfmadd231ps_fma(auVar110,auVar100,auVar104);
    auVar115._28_4_ = auVar103._28_4_;
    auVar115._0_28_ =
         ZEXT1628(CONCAT412(auVar80._12_4_ * fVar181,
                            CONCAT48(auVar80._8_4_ * fVar180,
                                     CONCAT44(auVar80._4_4_ * fVar179,auVar80._0_4_ * fVar163))));
    auVar77 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar181 * auVar79._12_4_,
                                                 CONCAT48(fVar180 * auVar79._8_4_,
                                                          CONCAT44(fVar179 * auVar79._4_4_,
                                                                   fVar163 * auVar79._0_4_)))),
                              auVar100,ZEXT1632(auVar78));
    auVar111 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar17._12_4_ * fVar181,
                                             CONCAT48(auVar17._8_4_ * fVar180,
                                                      CONCAT44(auVar17._4_4_ * fVar179,
                                                               auVar17._0_4_ * fVar163)))),auVar100,
                          auVar112);
    auVar110 = vfmadd231ps_avx512vl(auVar115,auVar100,auVar113);
    auVar102 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar81._12_4_ * fVar181,
                                             CONCAT48(auVar81._8_4_ * fVar180,
                                                      CONCAT44(auVar81._4_4_ * fVar179,
                                                               auVar81._0_4_ * fVar163)))),auVar114,
                          auVar100);
    auVar100 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar78));
    auVar104 = vsubps_avx512vl(ZEXT1632(auVar17),auVar112);
    auVar105 = vsubps_avx512vl(ZEXT1632(auVar80),auVar113);
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar81),auVar114);
    auVar129._0_4_ = fVar183 * auVar100._0_4_ * 3.0;
    auVar129._4_4_ = fVar183 * auVar100._4_4_ * 3.0;
    auVar129._8_4_ = fVar183 * auVar100._8_4_ * 3.0;
    auVar129._12_4_ = fVar183 * auVar100._12_4_ * 3.0;
    auVar129._16_4_ = fVar183 * auVar100._16_4_ * 3.0;
    auVar129._20_4_ = fVar183 * auVar100._20_4_ * 3.0;
    auVar129._24_4_ = fVar183 * auVar100._24_4_ * 3.0;
    auVar129._28_4_ = 0;
    auVar156._0_4_ = fVar183 * auVar104._0_4_ * 3.0;
    auVar156._4_4_ = fVar183 * auVar104._4_4_ * 3.0;
    auVar156._8_4_ = fVar183 * auVar104._8_4_ * 3.0;
    auVar156._12_4_ = fVar183 * auVar104._12_4_ * 3.0;
    auVar156._16_4_ = fVar183 * auVar104._16_4_ * 3.0;
    auVar156._20_4_ = fVar183 * auVar104._20_4_ * 3.0;
    auVar156._24_4_ = fVar183 * auVar104._24_4_ * 3.0;
    auVar156._28_4_ = 0;
    auVar112._4_4_ = fVar183 * auVar105._4_4_ * 3.0;
    auVar112._0_4_ = fVar183 * auVar105._0_4_ * 3.0;
    auVar112._8_4_ = fVar183 * auVar105._8_4_ * 3.0;
    auVar112._12_4_ = fVar183 * auVar105._12_4_ * 3.0;
    auVar112._16_4_ = fVar183 * auVar105._16_4_ * 3.0;
    auVar112._20_4_ = fVar183 * auVar105._20_4_ * 3.0;
    auVar112._24_4_ = fVar183 * auVar105._24_4_ * 3.0;
    auVar112._28_4_ = auVar108._28_4_;
    fVar163 = auVar106._0_4_ * 3.0 * fVar183;
    fVar179 = auVar106._4_4_ * 3.0 * fVar183;
    auVar113._4_4_ = fVar179;
    auVar113._0_4_ = fVar163;
    fVar180 = auVar106._8_4_ * 3.0 * fVar183;
    auVar113._8_4_ = fVar180;
    fVar181 = auVar106._12_4_ * 3.0 * fVar183;
    auVar113._12_4_ = fVar181;
    fVar182 = auVar106._16_4_ * 3.0 * fVar183;
    auVar113._16_4_ = fVar182;
    fVar184 = auVar106._20_4_ * 3.0 * fVar183;
    auVar113._20_4_ = fVar184;
    fVar185 = auVar106._24_4_ * 3.0 * fVar183;
    auVar113._24_4_ = fVar185;
    auVar113._28_4_ = fVar183;
    auVar78 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
    auVar115 = vpermt2ps_avx512vl(ZEXT1632(auVar77),_DAT_01feed00,ZEXT1632(auVar78));
    auVar116 = vpermt2ps_avx512vl(auVar111,_DAT_01feed00,ZEXT1632(auVar78));
    auVar104 = ZEXT1632(auVar78);
    auVar117 = vpermt2ps_avx512vl(auVar110,_DAT_01feed00,auVar104);
    auVar118._0_4_ = auVar102._0_4_ + fVar163;
    auVar118._4_4_ = auVar102._4_4_ + fVar179;
    auVar118._8_4_ = auVar102._8_4_ + fVar180;
    auVar118._12_4_ = auVar102._12_4_ + fVar181;
    auVar118._16_4_ = auVar102._16_4_ + fVar182;
    auVar118._20_4_ = auVar102._20_4_ + fVar184;
    auVar118._24_4_ = auVar102._24_4_ + fVar185;
    auVar118._28_4_ = auVar102._28_4_ + fVar183;
    auVar100 = vmaxps_avx(auVar102,auVar118);
    auVar103 = vminps_avx512vl(auVar102,auVar118);
    auVar107 = vpermt2ps_avx512vl(auVar102,_DAT_01feed00,auVar104);
    auVar118 = vpermt2ps_avx512vl(auVar129,_DAT_01feed00,auVar104);
    auVar119 = vpermt2ps_avx512vl(auVar156,_DAT_01feed00,auVar104);
    auVar126 = ZEXT1632(auVar78);
    auVar120 = vpermt2ps_avx512vl(auVar112,_DAT_01feed00,auVar126);
    auVar102 = vpermt2ps_avx512vl(auVar113,_DAT_01feed00,auVar126);
    auVar102 = vsubps_avx(auVar107,auVar102);
    auVar104 = vsubps_avx(auVar115,ZEXT1632(auVar77));
    auVar105 = vsubps_avx(auVar116,auVar111);
    auVar106 = vsubps_avx(auVar117,auVar110);
    auVar108 = vmulps_avx512vl(auVar105,auVar112);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar156,auVar106);
    auVar109 = vmulps_avx512vl(auVar106,auVar129);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar112,auVar104);
    auVar113 = vmulps_avx512vl(auVar104,auVar156);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar129,auVar105);
    auVar113 = vmulps_avx512vl(auVar113,auVar113);
    auVar109 = vfmadd231ps_avx512vl(auVar113,auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar109 = vmulps_avx512vl(auVar106,auVar106);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar105);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar104,auVar104);
    auVar113 = vrcp14ps_avx512vl(auVar109);
    auVar114 = vfnmadd213ps_avx512vl(auVar113,auVar109,auVar101);
    auVar113 = vfmadd132ps_avx512vl(auVar114,auVar113,auVar113);
    auVar108 = vmulps_avx512vl(auVar108,auVar113);
    auVar114 = vmulps_avx512vl(auVar105,auVar120);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar119,auVar106);
    auVar121 = vmulps_avx512vl(auVar106,auVar118);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar120,auVar104);
    auVar122 = vmulps_avx512vl(auVar104,auVar119);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar118,auVar105);
    auVar122 = vmulps_avx512vl(auVar122,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar121);
    auVar114 = vfmadd231ps_avx512vl(auVar121,auVar114,auVar114);
    auVar113 = vmulps_avx512vl(auVar114,auVar113);
    auVar108 = vmaxps_avx512vl(auVar108,auVar113);
    auVar108 = vsqrtps_avx512vl(auVar108);
    auVar113 = vmaxps_avx512vl(auVar102,auVar107);
    auVar100 = vmaxps_avx512vl(auVar100,auVar113);
    auVar113 = vaddps_avx512vl(auVar108,auVar100);
    auVar100 = vminps_avx(auVar102,auVar107);
    auVar100 = vminps_avx512vl(auVar103,auVar100);
    auVar100 = vsubps_avx512vl(auVar100,auVar108);
    auVar102._8_4_ = 0x3f800002;
    auVar102._0_8_ = 0x3f8000023f800002;
    auVar102._12_4_ = 0x3f800002;
    auVar102._16_4_ = 0x3f800002;
    auVar102._20_4_ = 0x3f800002;
    auVar102._24_4_ = 0x3f800002;
    auVar102._28_4_ = 0x3f800002;
    auVar102 = vmulps_avx512vl(auVar113,auVar102);
    auVar103._8_4_ = 0x3f7ffffc;
    auVar103._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar103._12_4_ = 0x3f7ffffc;
    auVar103._16_4_ = 0x3f7ffffc;
    auVar103._20_4_ = 0x3f7ffffc;
    auVar103._24_4_ = 0x3f7ffffc;
    auVar103._28_4_ = 0x3f7ffffc;
    auVar100 = vmulps_avx512vl(auVar100,auVar103);
    auVar102 = vmulps_avx512vl(auVar102,auVar102);
    auVar103 = vrsqrt14ps_avx512vl(auVar109);
    auVar107._8_4_ = 0xbf000000;
    auVar107._0_8_ = 0xbf000000bf000000;
    auVar107._12_4_ = 0xbf000000;
    auVar107._16_4_ = 0xbf000000;
    auVar107._20_4_ = 0xbf000000;
    auVar107._24_4_ = 0xbf000000;
    auVar107._28_4_ = 0xbf000000;
    auVar107 = vmulps_avx512vl(auVar109,auVar107);
    fVar163 = auVar103._0_4_;
    fVar179 = auVar103._4_4_;
    fVar180 = auVar103._8_4_;
    fVar181 = auVar103._12_4_;
    fVar183 = auVar103._16_4_;
    fVar182 = auVar103._20_4_;
    fVar184 = auVar103._24_4_;
    auVar114._4_4_ = fVar179 * fVar179 * fVar179 * auVar107._4_4_;
    auVar114._0_4_ = fVar163 * fVar163 * fVar163 * auVar107._0_4_;
    auVar114._8_4_ = fVar180 * fVar180 * fVar180 * auVar107._8_4_;
    auVar114._12_4_ = fVar181 * fVar181 * fVar181 * auVar107._12_4_;
    auVar114._16_4_ = fVar183 * fVar183 * fVar183 * auVar107._16_4_;
    auVar114._20_4_ = fVar182 * fVar182 * fVar182 * auVar107._20_4_;
    auVar114._24_4_ = fVar184 * fVar184 * fVar184 * auVar107._24_4_;
    auVar114._28_4_ = auVar113._28_4_;
    auVar108._8_4_ = 0x3fc00000;
    auVar108._0_8_ = 0x3fc000003fc00000;
    auVar108._12_4_ = 0x3fc00000;
    auVar108._16_4_ = 0x3fc00000;
    auVar108._20_4_ = 0x3fc00000;
    auVar108._24_4_ = 0x3fc00000;
    auVar108._28_4_ = 0x3fc00000;
    auVar103 = vfmadd231ps_avx512vl(auVar114,auVar103,auVar108);
    auVar107 = vmulps_avx512vl(auVar104,auVar103);
    auVar108 = vmulps_avx512vl(auVar105,auVar103);
    auVar109 = vmulps_avx512vl(auVar106,auVar103);
    auVar239 = ZEXT1632(auVar77);
    auVar113 = vsubps_avx512vl(auVar126,auVar239);
    auVar114 = vsubps_avx512vl(auVar126,auVar111);
    auVar121 = vsubps_avx512vl(auVar126,auVar110);
    auVar122 = vmulps_avx512vl(local_540,auVar121);
    auVar122 = vfmadd231ps_avx512vl(auVar122,local_520,auVar114);
    auVar122 = vfmadd231ps_avx512vl(auVar122,_local_500,auVar113);
    auVar123 = vmulps_avx512vl(auVar121,auVar121);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar114,auVar114);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar113,auVar113);
    auVar124 = vmulps_avx512vl(local_540,auVar109);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar108,local_520);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar107,_local_500);
    auVar109 = vmulps_avx512vl(auVar121,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar114,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar113,auVar107);
    auVar108 = vmulps_avx512vl(auVar124,auVar124);
    auVar125 = vsubps_avx512vl(local_220,auVar108);
    auVar109 = vmulps_avx512vl(auVar124,auVar107);
    auVar109 = vsubps_avx512vl(auVar122,auVar109);
    auVar122 = vaddps_avx512vl(auVar109,auVar109);
    auVar109 = vmulps_avx512vl(auVar107,auVar107);
    local_760 = vsubps_avx512vl(auVar123,auVar109);
    auVar102 = vsubps_avx512vl(local_760,auVar102);
    local_560 = vmulps_avx512vl(auVar122,auVar122);
    auVar109._8_4_ = 0x40800000;
    auVar109._0_8_ = 0x4080000040800000;
    auVar109._12_4_ = 0x40800000;
    auVar109._16_4_ = 0x40800000;
    auVar109._20_4_ = 0x40800000;
    auVar109._24_4_ = 0x40800000;
    auVar109._28_4_ = 0x40800000;
    _local_580 = vmulps_avx512vl(auVar125,auVar109);
    auVar109 = vmulps_avx512vl(_local_580,auVar102);
    auVar109 = vsubps_avx512vl(local_560,auVar109);
    uVar69 = vcmpps_avx512vl(auVar109,auVar126,5);
    bVar54 = (byte)uVar69;
    if (bVar54 == 0) {
LAB_01b6fb1e:
      auVar243 = ZEXT3264(local_6a0);
    }
    else {
      auVar109 = vsqrtps_avx512vl(auVar109);
      auVar126 = vaddps_avx512vl(auVar125,auVar125);
      local_780 = vrcp14ps_avx512vl(auVar126);
      auVar101 = vfnmadd213ps_avx512vl(local_780,auVar126,auVar101);
      auVar123 = vfmadd132ps_avx512vl(auVar101,local_780,local_780);
      auVar101._8_4_ = 0x80000000;
      auVar101._0_8_ = 0x8000000080000000;
      auVar101._12_4_ = 0x80000000;
      auVar101._16_4_ = 0x80000000;
      auVar101._20_4_ = 0x80000000;
      auVar101._24_4_ = 0x80000000;
      auVar101._28_4_ = 0x80000000;
      local_5a0 = vxorps_avx512vl(auVar122,auVar101);
      auVar101 = vsubps_avx512vl(local_5a0,auVar109);
      local_7c0 = vmulps_avx512vl(auVar101,auVar123);
      auVar109 = vsubps_avx512vl(auVar109,auVar122);
      local_5c0 = vmulps_avx512vl(auVar109,auVar123);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar101 = vblendmps_avx512vl(auVar109,local_7c0);
      auVar127._0_4_ =
           (uint)(bVar54 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar109._0_4_;
      bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar67 * auVar101._4_4_ | (uint)!bVar67 * auVar109._4_4_;
      bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar67 * auVar101._8_4_ | (uint)!bVar67 * auVar109._8_4_;
      bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar67 * auVar101._12_4_ | (uint)!bVar67 * auVar109._12_4_;
      bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar67 * auVar101._16_4_ | (uint)!bVar67 * auVar109._16_4_;
      bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar67 * auVar101._20_4_ | (uint)!bVar67 * auVar109._20_4_;
      bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar67 * auVar101._24_4_ | (uint)!bVar67 * auVar109._24_4_;
      bVar67 = SUB81(uVar69 >> 7,0);
      auVar127._28_4_ = (uint)bVar67 * auVar101._28_4_ | (uint)!bVar67 * auVar109._28_4_;
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar101 = vblendmps_avx512vl(auVar109,local_5c0);
      auVar128._0_4_ =
           (uint)(bVar54 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar109._0_4_;
      bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar67 * auVar101._4_4_ | (uint)!bVar67 * auVar109._4_4_;
      bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar67 * auVar101._8_4_ | (uint)!bVar67 * auVar109._8_4_;
      bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar67 * auVar101._12_4_ | (uint)!bVar67 * auVar109._12_4_;
      bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar128._16_4_ = (uint)bVar67 * auVar101._16_4_ | (uint)!bVar67 * auVar109._16_4_;
      bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar128._20_4_ = (uint)bVar67 * auVar101._20_4_ | (uint)!bVar67 * auVar109._20_4_;
      bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar128._24_4_ = (uint)bVar67 * auVar101._24_4_ | (uint)!bVar67 * auVar109._24_4_;
      bVar67 = SUB81(uVar69 >> 7,0);
      auVar128._28_4_ = (uint)bVar67 * auVar101._28_4_ | (uint)!bVar67 * auVar109._28_4_;
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar108,auVar109);
      local_5e0 = vmaxps_avx512vl(local_240,auVar109);
      auVar123._8_4_ = 0x36000000;
      auVar123._0_8_ = 0x3600000036000000;
      auVar123._12_4_ = 0x36000000;
      auVar123._16_4_ = 0x36000000;
      auVar123._20_4_ = 0x36000000;
      auVar123._24_4_ = 0x36000000;
      auVar123._28_4_ = 0x36000000;
      local_600 = vmulps_avx512vl(local_5e0,auVar123);
      vandps_avx512vl(auVar125,auVar109);
      uVar57 = vcmpps_avx512vl(local_600,local_600,1);
      uVar69 = uVar69 & uVar57;
      bVar58 = (byte)uVar69;
      if (bVar58 != 0) {
        uVar57 = vcmpps_avx512vl(auVar102,_DAT_01faff00,2);
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar109 = vblendmps_avx512vl(auVar102,auVar108);
        bVar59 = (byte)uVar57;
        uVar71 = (uint)(bVar59 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar59 & 1) * local_600._0_4_;
        bVar67 = (bool)((byte)(uVar57 >> 1) & 1);
        uVar70 = (uint)bVar67 * auVar109._4_4_ | (uint)!bVar67 * local_600._4_4_;
        bVar67 = (bool)((byte)(uVar57 >> 2) & 1);
        uVar137 = (uint)bVar67 * auVar109._8_4_ | (uint)!bVar67 * local_600._8_4_;
        bVar67 = (bool)((byte)(uVar57 >> 3) & 1);
        uVar138 = (uint)bVar67 * auVar109._12_4_ | (uint)!bVar67 * local_600._12_4_;
        bVar67 = (bool)((byte)(uVar57 >> 4) & 1);
        uVar139 = (uint)bVar67 * auVar109._16_4_ | (uint)!bVar67 * local_600._16_4_;
        bVar67 = (bool)((byte)(uVar57 >> 5) & 1);
        uVar140 = (uint)bVar67 * auVar109._20_4_ | (uint)!bVar67 * local_600._20_4_;
        bVar67 = (bool)((byte)(uVar57 >> 6) & 1);
        uVar141 = (uint)bVar67 * auVar109._24_4_ | (uint)!bVar67 * local_600._24_4_;
        bVar67 = SUB81(uVar57 >> 7,0);
        uVar142 = (uint)bVar67 * auVar109._28_4_ | (uint)!bVar67 * local_600._28_4_;
        auVar127._0_4_ = (bVar58 & 1) * uVar71 | !(bool)(bVar58 & 1) * auVar127._0_4_;
        bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar127._4_4_ = bVar67 * uVar70 | !bVar67 * auVar127._4_4_;
        bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar127._8_4_ = bVar67 * uVar137 | !bVar67 * auVar127._8_4_;
        bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar127._12_4_ = bVar67 * uVar138 | !bVar67 * auVar127._12_4_;
        bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar127._16_4_ = bVar67 * uVar139 | !bVar67 * auVar127._16_4_;
        bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar127._20_4_ = bVar67 * uVar140 | !bVar67 * auVar127._20_4_;
        bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar127._24_4_ = bVar67 * uVar141 | !bVar67 * auVar127._24_4_;
        bVar67 = SUB81(uVar69 >> 7,0);
        auVar127._28_4_ = bVar67 * uVar142 | !bVar67 * auVar127._28_4_;
        auVar102 = vblendmps_avx512vl(auVar108,auVar102);
        bVar67 = (bool)((byte)(uVar57 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar57 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar57 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar57 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar57 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar57 >> 6) & 1);
        bVar14 = SUB81(uVar57 >> 7,0);
        auVar128._0_4_ =
             (uint)(bVar58 & 1) *
             ((uint)(bVar59 & 1) * auVar102._0_4_ | !(bool)(bVar59 & 1) * uVar71) |
             !(bool)(bVar58 & 1) * auVar128._0_4_;
        bVar8 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar128._4_4_ =
             (uint)bVar8 * ((uint)bVar67 * auVar102._4_4_ | !bVar67 * uVar70) |
             !bVar8 * auVar128._4_4_;
        bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar128._8_4_ =
             (uint)bVar67 * ((uint)bVar9 * auVar102._8_4_ | !bVar9 * uVar137) |
             !bVar67 * auVar128._8_4_;
        bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar128._12_4_ =
             (uint)bVar67 * ((uint)bVar10 * auVar102._12_4_ | !bVar10 * uVar138) |
             !bVar67 * auVar128._12_4_;
        bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar128._16_4_ =
             (uint)bVar67 * ((uint)bVar11 * auVar102._16_4_ | !bVar11 * uVar139) |
             !bVar67 * auVar128._16_4_;
        bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar128._20_4_ =
             (uint)bVar67 * ((uint)bVar12 * auVar102._20_4_ | !bVar12 * uVar140) |
             !bVar67 * auVar128._20_4_;
        bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar128._24_4_ =
             (uint)bVar67 * ((uint)bVar13 * auVar102._24_4_ | !bVar13 * uVar141) |
             !bVar67 * auVar128._24_4_;
        bVar67 = SUB81(uVar69 >> 7,0);
        auVar128._28_4_ =
             (uint)bVar67 * ((uint)bVar14 * auVar102._28_4_ | !bVar14 * uVar142) |
             !bVar67 * auVar128._28_4_;
        bVar54 = (~bVar58 | bVar59) & bVar54;
      }
      if ((bVar54 & 0x7f) == 0) goto LAB_01b6fb1e;
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar108 = vxorps_avx512vl(auVar120,auVar102);
      auVar109 = vxorps_avx512vl(auVar118,auVar102);
      uVar71 = *(uint *)(ray + k * 4 + 0x100);
      auVar101 = vxorps_avx512vl(auVar119,auVar102);
      auVar78 = vsubss_avx512f(ZEXT416(uVar71),ZEXT416((uint)local_710._0_4_));
      auVar118 = vbroadcastss_avx512vl(auVar78);
      auVar118 = vminps_avx512vl(auVar118,auVar128);
      auVar125._4_4_ = fStack_25c;
      auVar125._0_4_ = local_260;
      auVar125._8_4_ = fStack_258;
      auVar125._12_4_ = fStack_254;
      auVar125._16_4_ = fStack_250;
      auVar125._20_4_ = fStack_24c;
      auVar125._24_4_ = fStack_248;
      auVar125._28_4_ = fStack_244;
      auVar120 = vmaxps_avx512vl(auVar125,auVar127);
      auVar119 = vmulps_avx512vl(auVar121,auVar112);
      auVar114 = vfmadd213ps_avx512vl(auVar114,auVar156,auVar119);
      auVar78 = vfmadd213ps_fma(auVar113,auVar129,auVar114);
      auVar112 = vmulps_avx512vl(local_540,auVar112);
      auVar112 = vfmadd231ps_avx512vl(auVar112,local_520,auVar156);
      auVar79 = vfmadd231ps_fma(auVar112,_local_500,auVar129);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar79),auVar112);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar21 = vcmpps_avx512vl(auVar112,auVar113,1);
      auVar114 = vxorps_avx512vl(ZEXT1632(auVar78),auVar102);
      auVar121 = vrcp14ps_avx512vl(ZEXT1632(auVar79));
      auVar156 = ZEXT1632(auVar79);
      auVar123 = vxorps_avx512vl(auVar156,auVar102);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar119 = vfnmadd213ps_avx512vl(auVar121,auVar156,auVar125);
      auVar78 = vfmadd132ps_fma(auVar119,auVar121,auVar121);
      fVar163 = auVar78._0_4_ * auVar114._0_4_;
      fVar179 = auVar78._4_4_ * auVar114._4_4_;
      auVar119._4_4_ = fVar179;
      auVar119._0_4_ = fVar163;
      fVar180 = auVar78._8_4_ * auVar114._8_4_;
      auVar119._8_4_ = fVar180;
      fVar181 = auVar78._12_4_ * auVar114._12_4_;
      auVar119._12_4_ = fVar181;
      fVar183 = auVar114._16_4_ * 0.0;
      auVar119._16_4_ = fVar183;
      fVar182 = auVar114._20_4_ * 0.0;
      auVar119._20_4_ = fVar182;
      fVar184 = auVar114._24_4_ * 0.0;
      auVar119._24_4_ = fVar184;
      auVar119._28_4_ = auVar114._28_4_;
      uVar22 = vcmpps_avx512vl(auVar156,auVar123,1);
      bVar58 = (byte)uVar21 | (byte)uVar22;
      auVar129 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar119 = vblendmps_avx512vl(auVar119,auVar129);
      auVar130._0_4_ =
           (uint)(bVar58 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar121._0_4_;
      bVar67 = (bool)(bVar58 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar67 * auVar119._4_4_ | (uint)!bVar67 * auVar121._4_4_;
      bVar67 = (bool)(bVar58 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar67 * auVar119._8_4_ | (uint)!bVar67 * auVar121._8_4_;
      bVar67 = (bool)(bVar58 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar67 * auVar119._12_4_ | (uint)!bVar67 * auVar121._12_4_;
      bVar67 = (bool)(bVar58 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar67 * auVar119._16_4_ | (uint)!bVar67 * auVar121._16_4_;
      bVar67 = (bool)(bVar58 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar67 * auVar119._20_4_ | (uint)!bVar67 * auVar121._20_4_;
      bVar67 = (bool)(bVar58 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar67 * auVar119._24_4_ | (uint)!bVar67 * auVar121._24_4_;
      auVar130._28_4_ =
           (uint)(bVar58 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar58 >> 7) * auVar121._28_4_;
      auVar119 = vmaxps_avx512vl(auVar120,auVar130);
      uVar22 = vcmpps_avx512vl(auVar156,auVar123,6);
      bVar58 = (byte)uVar21 | (byte)uVar22;
      auVar121._0_4_ = (uint)(bVar58 & 1) * 0x7f800000 | (uint)!(bool)(bVar58 & 1) * (int)fVar163;
      bVar67 = (bool)(bVar58 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar179;
      bVar67 = (bool)(bVar58 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar180;
      bVar67 = (bool)(bVar58 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar181;
      bVar67 = (bool)(bVar58 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar183;
      bVar67 = (bool)(bVar58 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar182;
      bVar67 = (bool)(bVar58 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar184;
      auVar121._28_4_ =
           (uint)(bVar58 >> 7) * 0x7f800000 | (uint)!(bool)(bVar58 >> 7) * auVar114._28_4_;
      auVar114 = vminps_avx512vl(auVar118,auVar121);
      auVar78 = vxorps_avx512vl(auVar120._0_16_,auVar120._0_16_);
      auVar115 = vsubps_avx512vl(ZEXT1632(auVar78),auVar115);
      auVar116 = vsubps_avx512vl(ZEXT1632(auVar78),auVar116);
      auVar121 = ZEXT1632(auVar78);
      auVar117 = vsubps_avx512vl(auVar121,auVar117);
      auVar117 = vmulps_avx512vl(auVar117,auVar108);
      auVar116 = vfmadd231ps_avx512vl(auVar117,auVar101,auVar116);
      auVar115 = vfmadd231ps_avx512vl(auVar116,auVar109,auVar115);
      auVar108 = vmulps_avx512vl(local_540,auVar108);
      auVar108 = vfmadd231ps_avx512vl(auVar108,local_520,auVar101);
      auVar108 = vfmadd231ps_avx512vl(auVar108,_local_500,auVar109);
      vandps_avx512vl(auVar108,auVar112);
      uVar21 = vcmpps_avx512vl(auVar108,auVar113,1);
      auVar109 = vxorps_avx512vl(auVar115,auVar102);
      auVar115 = vrcp14ps_avx512vl(auVar108);
      auVar112 = vxorps_avx512vl(auVar108,auVar102);
      auVar102 = vfnmadd213ps_avx512vl(auVar115,auVar108,auVar125);
      auVar78 = vfmadd132ps_fma(auVar102,auVar115,auVar115);
      fVar163 = auVar78._0_4_ * auVar109._0_4_;
      fVar179 = auVar78._4_4_ * auVar109._4_4_;
      auVar120._4_4_ = fVar179;
      auVar120._0_4_ = fVar163;
      fVar180 = auVar78._8_4_ * auVar109._8_4_;
      auVar120._8_4_ = fVar180;
      fVar181 = auVar78._12_4_ * auVar109._12_4_;
      auVar120._12_4_ = fVar181;
      fVar183 = auVar109._16_4_ * 0.0;
      auVar120._16_4_ = fVar183;
      fVar182 = auVar109._20_4_ * 0.0;
      auVar120._20_4_ = fVar182;
      fVar184 = auVar109._24_4_ * 0.0;
      auVar120._24_4_ = fVar184;
      auVar120._28_4_ = auVar109._28_4_;
      uVar22 = vcmpps_avx512vl(auVar108,auVar112,1);
      bVar58 = (byte)uVar21 | (byte)uVar22;
      auVar102 = vblendmps_avx512vl(auVar120,auVar129);
      auVar131._0_4_ =
           (uint)(bVar58 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar115._0_4_;
      bVar67 = (bool)(bVar58 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar67 * auVar102._4_4_ | (uint)!bVar67 * auVar115._4_4_;
      bVar67 = (bool)(bVar58 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar67 * auVar102._8_4_ | (uint)!bVar67 * auVar115._8_4_;
      bVar67 = (bool)(bVar58 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar67 * auVar102._12_4_ | (uint)!bVar67 * auVar115._12_4_;
      bVar67 = (bool)(bVar58 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar67 * auVar102._16_4_ | (uint)!bVar67 * auVar115._16_4_;
      bVar67 = (bool)(bVar58 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar67 * auVar102._20_4_ | (uint)!bVar67 * auVar115._20_4_;
      bVar67 = (bool)(bVar58 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar67 * auVar102._24_4_ | (uint)!bVar67 * auVar115._24_4_;
      auVar131._28_4_ =
           (uint)(bVar58 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar58 >> 7) * auVar115._28_4_;
      auVar102 = vmaxps_avx(auVar119,auVar131);
      uVar22 = vcmpps_avx512vl(auVar108,auVar112,6);
      bVar58 = (byte)uVar21 | (byte)uVar22;
      auVar132._0_4_ = (uint)(bVar58 & 1) * 0x7f800000 | (uint)!(bool)(bVar58 & 1) * (int)fVar163;
      bVar67 = (bool)(bVar58 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar179;
      bVar67 = (bool)(bVar58 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar180;
      bVar67 = (bool)(bVar58 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar181;
      bVar67 = (bool)(bVar58 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar183;
      bVar67 = (bool)(bVar58 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar182;
      bVar67 = (bool)(bVar58 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar184;
      auVar132._28_4_ =
           (uint)(bVar58 >> 7) * 0x7f800000 | (uint)!(bool)(bVar58 >> 7) * auVar109._28_4_;
      local_2c0 = vminps_avx(auVar114,auVar132);
      uVar21 = vcmpps_avx512vl(auVar102,local_2c0,2);
      bVar54 = bVar54 & 0x7f & (byte)uVar21;
      if (bVar54 == 0) {
        auVar273 = ZEXT3264(local_7e0);
        goto LAB_01b6fb1e;
      }
      auVar108 = vmaxps_avx512vl(auVar121,auVar100);
      auVar100 = vfmadd213ps_avx512vl(local_7c0,auVar124,auVar107);
      fVar163 = auVar103._0_4_;
      fVar179 = auVar103._4_4_;
      auVar42._4_4_ = fVar179 * auVar100._4_4_;
      auVar42._0_4_ = fVar163 * auVar100._0_4_;
      fVar180 = auVar103._8_4_;
      auVar42._8_4_ = fVar180 * auVar100._8_4_;
      fVar181 = auVar103._12_4_;
      auVar42._12_4_ = fVar181 * auVar100._12_4_;
      fVar183 = auVar103._16_4_;
      auVar42._16_4_ = fVar183 * auVar100._16_4_;
      fVar182 = auVar103._20_4_;
      auVar42._20_4_ = fVar182 * auVar100._20_4_;
      fVar184 = auVar103._24_4_;
      auVar42._24_4_ = fVar184 * auVar100._24_4_;
      auVar42._28_4_ = auVar100._28_4_;
      auVar100 = vfmadd213ps_avx512vl(local_5c0,auVar124,auVar107);
      auVar43._4_4_ = fVar179 * auVar100._4_4_;
      auVar43._0_4_ = fVar163 * auVar100._0_4_;
      auVar43._8_4_ = fVar180 * auVar100._8_4_;
      auVar43._12_4_ = fVar181 * auVar100._12_4_;
      auVar43._16_4_ = fVar183 * auVar100._16_4_;
      auVar43._20_4_ = fVar182 * auVar100._20_4_;
      auVar43._24_4_ = fVar184 * auVar100._24_4_;
      auVar43._28_4_ = auVar131._28_4_;
      auVar100 = vminps_avx512vl(auVar42,auVar125);
      auVar51 = ZEXT812(0);
      auVar109 = ZEXT1232(auVar51) << 0x20;
      auVar100 = vmaxps_avx(auVar100,ZEXT1232(auVar51) << 0x20);
      auVar115 = vminps_avx512vl(auVar43,auVar125);
      auVar44._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
      auVar44._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
      auVar44._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
      auVar44._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
      auVar44._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
      auVar44._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
      auVar44._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
      auVar44._28_4_ = auVar100._28_4_ + 7.0;
      auVar78 = vfmadd213ps_fma(auVar44,auVar253,auVar229);
      local_1e0 = ZEXT1632(auVar78);
      auVar100 = vmaxps_avx(auVar115,ZEXT1232(auVar51) << 0x20);
      auVar45._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar100._28_4_ + 7.0;
      auVar78 = vfmadd213ps_fma(auVar45,auVar253,auVar229);
      local_200 = ZEXT1632(auVar78);
      auVar46._4_4_ = auVar108._4_4_ * auVar108._4_4_;
      auVar46._0_4_ = auVar108._0_4_ * auVar108._0_4_;
      auVar46._8_4_ = auVar108._8_4_ * auVar108._8_4_;
      auVar46._12_4_ = auVar108._12_4_ * auVar108._12_4_;
      auVar46._16_4_ = auVar108._16_4_ * auVar108._16_4_;
      auVar46._20_4_ = auVar108._20_4_ * auVar108._20_4_;
      auVar46._24_4_ = auVar108._24_4_ * auVar108._24_4_;
      auVar46._28_4_ = auVar108._28_4_;
      auVar100 = vsubps_avx(local_760,auVar46);
      auVar47._4_4_ = auVar100._4_4_ * (float)local_580._4_4_;
      auVar47._0_4_ = auVar100._0_4_ * (float)local_580._0_4_;
      auVar47._8_4_ = auVar100._8_4_ * fStack_578;
      auVar47._12_4_ = auVar100._12_4_ * fStack_574;
      auVar47._16_4_ = auVar100._16_4_ * fStack_570;
      auVar47._20_4_ = auVar100._20_4_ * fStack_56c;
      auVar47._24_4_ = auVar100._24_4_ * fStack_568;
      auVar47._28_4_ = auVar108._28_4_;
      auVar108 = vsubps_avx(local_560,auVar47);
      uVar21 = vcmpps_avx512vl(auVar108,ZEXT1232(auVar51) << 0x20,5);
      bVar58 = (byte)uVar21;
      auVar273 = ZEXT3264(local_7e0);
      if (bVar58 == 0) {
        bVar58 = 0;
        auVar104 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar243 = ZEXT864(0) << 0x20;
        auVar108 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar115 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar269 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar122._8_4_ = 0x7f800000;
        auVar122._0_8_ = 0x7f8000007f800000;
        auVar122._12_4_ = 0x7f800000;
        auVar122._16_4_ = 0x7f800000;
        auVar122._20_4_ = 0x7f800000;
        auVar122._24_4_ = 0x7f800000;
        auVar122._28_4_ = 0x7f800000;
        auVar124._8_4_ = 0xff800000;
        auVar124._0_8_ = 0xff800000ff800000;
        auVar124._12_4_ = 0xff800000;
        auVar124._16_4_ = 0xff800000;
        auVar124._20_4_ = 0xff800000;
        auVar124._24_4_ = 0xff800000;
        auVar124._28_4_ = 0xff800000;
      }
      else {
        auVar79 = vxorps_avx512vl(auVar118._0_16_,auVar118._0_16_);
        uVar69 = vcmpps_avx512vl(auVar108,auVar121,5);
        auVar108 = vsqrtps_avx(auVar108);
        auVar109 = vfnmadd213ps_avx512vl(auVar126,local_780,auVar125);
        auVar112 = vfmadd132ps_avx512vl(auVar109,local_780,local_780);
        auVar109 = vsubps_avx(local_5a0,auVar108);
        auVar113 = vmulps_avx512vl(auVar109,auVar112);
        auVar108 = vsubps_avx512vl(auVar108,auVar122);
        auVar112 = vmulps_avx512vl(auVar108,auVar112);
        auVar108 = vfmadd213ps_avx512vl(auVar124,auVar113,auVar107);
        auVar126._4_4_ = fVar179 * auVar108._4_4_;
        auVar126._0_4_ = fVar163 * auVar108._0_4_;
        auVar126._8_4_ = fVar180 * auVar108._8_4_;
        auVar126._12_4_ = fVar181 * auVar108._12_4_;
        auVar126._16_4_ = fVar183 * auVar108._16_4_;
        auVar126._20_4_ = fVar182 * auVar108._20_4_;
        auVar126._24_4_ = fVar184 * auVar108._24_4_;
        auVar126._28_4_ = auVar115._28_4_;
        auVar48._4_4_ = (float)local_500._4_4_ * auVar113._4_4_;
        auVar48._0_4_ = (float)local_500._0_4_ * auVar113._0_4_;
        auVar48._8_4_ = fStack_4f8 * auVar113._8_4_;
        auVar48._12_4_ = fStack_4f4 * auVar113._12_4_;
        auVar48._16_4_ = fStack_4f0 * auVar113._16_4_;
        auVar48._20_4_ = fStack_4ec * auVar113._20_4_;
        auVar48._24_4_ = fStack_4e8 * auVar113._24_4_;
        auVar48._28_4_ = auVar108._28_4_;
        auVar109 = vmulps_avx512vl(local_520,auVar113);
        auVar114 = vmulps_avx512vl(local_540,auVar113);
        auVar108 = vfmadd213ps_avx512vl(auVar104,auVar126,auVar239);
        auVar108 = vsubps_avx512vl(auVar48,auVar108);
        auVar115 = vfmadd213ps_avx512vl(auVar105,auVar126,auVar111);
        auVar115 = vsubps_avx512vl(auVar109,auVar115);
        auVar78 = vfmadd213ps_fma(auVar126,auVar106,auVar110);
        auVar109 = vsubps_avx(auVar114,ZEXT1632(auVar78));
        auVar269 = auVar109._0_28_;
        auVar107 = vfmadd213ps_avx512vl(auVar124,auVar112,auVar107);
        auVar103 = vmulps_avx512vl(auVar103,auVar107);
        auVar49._4_4_ = (float)local_500._4_4_ * auVar112._4_4_;
        auVar49._0_4_ = (float)local_500._0_4_ * auVar112._0_4_;
        auVar49._8_4_ = fStack_4f8 * auVar112._8_4_;
        auVar49._12_4_ = fStack_4f4 * auVar112._12_4_;
        auVar49._16_4_ = fStack_4f0 * auVar112._16_4_;
        auVar49._20_4_ = fStack_4ec * auVar112._20_4_;
        auVar49._24_4_ = fStack_4e8 * auVar112._24_4_;
        auVar49._28_4_ = auVar114._28_4_;
        auVar107 = vmulps_avx512vl(local_520,auVar112);
        auVar114 = vmulps_avx512vl(local_540,auVar112);
        auVar78 = vfmadd213ps_fma(auVar104,auVar103,auVar239);
        auVar109 = vsubps_avx(auVar49,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar105,auVar103,auVar111);
        auVar104 = vsubps_avx512vl(auVar107,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar106,auVar103,auVar110);
        auVar105 = vsubps_avx512vl(auVar114,ZEXT1632(auVar78));
        auVar243 = ZEXT3264(auVar105);
        auVar212._8_4_ = 0x7f800000;
        auVar212._0_8_ = 0x7f8000007f800000;
        auVar212._12_4_ = 0x7f800000;
        auVar212._16_4_ = 0x7f800000;
        auVar212._20_4_ = 0x7f800000;
        auVar212._24_4_ = 0x7f800000;
        auVar212._28_4_ = 0x7f800000;
        auVar105 = vblendmps_avx512vl(auVar212,auVar113);
        bVar67 = (bool)((byte)uVar69 & 1);
        auVar122._0_4_ = (uint)bVar67 * auVar105._0_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar67 * auVar105._4_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar67 * auVar105._8_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar67 * auVar105._12_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar122._16_4_ = (uint)bVar67 * auVar105._16_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar122._20_4_ = (uint)bVar67 * auVar105._20_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar122._24_4_ = (uint)bVar67 * auVar105._24_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = SUB81(uVar69 >> 7,0);
        auVar122._28_4_ = (uint)bVar67 * auVar105._28_4_ | (uint)!bVar67 * 0x7f800000;
        auVar240._8_4_ = 0xff800000;
        auVar240._0_8_ = 0xff800000ff800000;
        auVar240._12_4_ = 0xff800000;
        auVar240._16_4_ = 0xff800000;
        auVar240._20_4_ = 0xff800000;
        auVar240._24_4_ = 0xff800000;
        auVar240._28_4_ = 0xff800000;
        auVar105 = vblendmps_avx512vl(auVar240,auVar112);
        bVar67 = (bool)((byte)uVar69 & 1);
        auVar124._0_4_ = (uint)bVar67 * auVar105._0_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar67 * auVar105._4_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar67 * auVar105._8_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar67 * auVar105._12_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar124._16_4_ = (uint)bVar67 * auVar105._16_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar124._20_4_ = (uint)bVar67 * auVar105._20_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar124._24_4_ = (uint)bVar67 * auVar105._24_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = SUB81(uVar69 >> 7,0);
        auVar124._28_4_ = (uint)bVar67 * auVar105._28_4_ | (uint)!bVar67 * -0x800000;
        auVar239._8_4_ = 0x36000000;
        auVar239._0_8_ = 0x3600000036000000;
        auVar239._12_4_ = 0x36000000;
        auVar239._16_4_ = 0x36000000;
        auVar239._20_4_ = 0x36000000;
        auVar239._24_4_ = 0x36000000;
        auVar239._28_4_ = 0x36000000;
        auVar105 = vmulps_avx512vl(local_5e0,auVar239);
        uVar57 = vcmpps_avx512vl(auVar105,local_600,0xe);
        uVar69 = uVar69 & uVar57;
        bVar59 = (byte)uVar69;
        if (bVar59 != 0) {
          uVar57 = vcmpps_avx512vl(auVar100,ZEXT1632(auVar79),2);
          auVar267._8_4_ = 0x7f800000;
          auVar267._0_8_ = 0x7f8000007f800000;
          auVar267._12_4_ = 0x7f800000;
          auVar267._16_4_ = 0x7f800000;
          auVar267._20_4_ = 0x7f800000;
          auVar267._24_4_ = 0x7f800000;
          auVar267._28_4_ = 0x7f800000;
          auVar270._8_4_ = 0xff800000;
          auVar270._0_8_ = 0xff800000ff800000;
          auVar270._12_4_ = 0xff800000;
          auVar270._16_4_ = 0xff800000;
          auVar270._20_4_ = 0xff800000;
          auVar270._24_4_ = 0xff800000;
          auVar270._28_4_ = 0xff800000;
          auVar100 = vblendmps_avx512vl(auVar267,auVar270);
          bVar63 = (byte)uVar57;
          uVar70 = (uint)(bVar63 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar105._0_4_;
          bVar67 = (bool)((byte)(uVar57 >> 1) & 1);
          uVar137 = (uint)bVar67 * auVar100._4_4_ | (uint)!bVar67 * auVar105._4_4_;
          bVar67 = (bool)((byte)(uVar57 >> 2) & 1);
          uVar138 = (uint)bVar67 * auVar100._8_4_ | (uint)!bVar67 * auVar105._8_4_;
          bVar67 = (bool)((byte)(uVar57 >> 3) & 1);
          uVar139 = (uint)bVar67 * auVar100._12_4_ | (uint)!bVar67 * auVar105._12_4_;
          bVar67 = (bool)((byte)(uVar57 >> 4) & 1);
          uVar140 = (uint)bVar67 * auVar100._16_4_ | (uint)!bVar67 * auVar105._16_4_;
          bVar67 = (bool)((byte)(uVar57 >> 5) & 1);
          uVar141 = (uint)bVar67 * auVar100._20_4_ | (uint)!bVar67 * auVar105._20_4_;
          bVar67 = (bool)((byte)(uVar57 >> 6) & 1);
          uVar142 = (uint)bVar67 * auVar100._24_4_ | (uint)!bVar67 * auVar105._24_4_;
          bVar67 = SUB81(uVar57 >> 7,0);
          uVar143 = (uint)bVar67 * auVar100._28_4_ | (uint)!bVar67 * auVar105._28_4_;
          auVar122._0_4_ = (bVar59 & 1) * uVar70 | !(bool)(bVar59 & 1) * auVar122._0_4_;
          bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar122._4_4_ = bVar67 * uVar137 | !bVar67 * auVar122._4_4_;
          bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar122._8_4_ = bVar67 * uVar138 | !bVar67 * auVar122._8_4_;
          bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar122._12_4_ = bVar67 * uVar139 | !bVar67 * auVar122._12_4_;
          bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar122._16_4_ = bVar67 * uVar140 | !bVar67 * auVar122._16_4_;
          bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar122._20_4_ = bVar67 * uVar141 | !bVar67 * auVar122._20_4_;
          bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar122._24_4_ = bVar67 * uVar142 | !bVar67 * auVar122._24_4_;
          bVar67 = SUB81(uVar69 >> 7,0);
          auVar122._28_4_ = bVar67 * uVar143 | !bVar67 * auVar122._28_4_;
          auVar100 = vblendmps_avx512vl(auVar270,auVar267);
          bVar67 = (bool)((byte)(uVar57 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar57 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar57 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar57 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar57 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar57 >> 6) & 1);
          bVar14 = SUB81(uVar57 >> 7,0);
          auVar124._0_4_ =
               (uint)(bVar59 & 1) *
               ((uint)(bVar63 & 1) * auVar100._0_4_ | !(bool)(bVar63 & 1) * uVar70) |
               !(bool)(bVar59 & 1) * auVar124._0_4_;
          bVar8 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar124._4_4_ =
               (uint)bVar8 * ((uint)bVar67 * auVar100._4_4_ | !bVar67 * uVar137) |
               !bVar8 * auVar124._4_4_;
          bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar124._8_4_ =
               (uint)bVar67 * ((uint)bVar9 * auVar100._8_4_ | !bVar9 * uVar138) |
               !bVar67 * auVar124._8_4_;
          bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar124._12_4_ =
               (uint)bVar67 * ((uint)bVar10 * auVar100._12_4_ | !bVar10 * uVar139) |
               !bVar67 * auVar124._12_4_;
          bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar124._16_4_ =
               (uint)bVar67 * ((uint)bVar11 * auVar100._16_4_ | !bVar11 * uVar140) |
               !bVar67 * auVar124._16_4_;
          bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar124._20_4_ =
               (uint)bVar67 * ((uint)bVar12 * auVar100._20_4_ | !bVar12 * uVar141) |
               !bVar67 * auVar124._20_4_;
          bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar124._24_4_ =
               (uint)bVar67 * ((uint)bVar13 * auVar100._24_4_ | !bVar13 * uVar142) |
               !bVar67 * auVar124._24_4_;
          bVar67 = SUB81(uVar69 >> 7,0);
          auVar124._28_4_ =
               (uint)bVar67 * ((uint)bVar14 * auVar100._28_4_ | !bVar14 * uVar143) |
               !bVar67 * auVar124._28_4_;
          bVar58 = (~bVar59 | bVar63) & bVar58;
        }
      }
      auVar255._0_4_ = local_540._0_4_ * auVar243._0_4_;
      auVar255._4_4_ = local_540._4_4_ * auVar243._4_4_;
      auVar255._8_4_ = local_540._8_4_ * auVar243._8_4_;
      auVar255._12_4_ = local_540._12_4_ * auVar243._12_4_;
      auVar255._16_4_ = local_540._16_4_ * auVar243._16_4_;
      auVar255._20_4_ = local_540._20_4_ * auVar243._20_4_;
      auVar255._28_36_ = auVar243._28_36_;
      auVar255._24_4_ = local_540._24_4_ * auVar243._24_4_;
      auVar78 = vfmadd231ps_fma(auVar255._0_32_,local_520,auVar104);
      auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),_local_500,auVar109);
      auVar262._8_4_ = 0x7fffffff;
      auVar262._0_8_ = 0x7fffffff7fffffff;
      auVar262._12_4_ = 0x7fffffff;
      auVar262._16_4_ = 0x7fffffff;
      auVar262._20_4_ = 0x7fffffff;
      auVar262._24_4_ = 0x7fffffff;
      auVar262._28_4_ = 0x7fffffff;
      auVar100 = vandps_avx(ZEXT1632(auVar78),auVar262);
      _local_1c0 = auVar102;
      auVar254._8_4_ = 0x3e99999a;
      auVar254._0_8_ = 0x3e99999a3e99999a;
      auVar254._12_4_ = 0x3e99999a;
      auVar254._16_4_ = 0x3e99999a;
      auVar254._20_4_ = 0x3e99999a;
      auVar254._24_4_ = 0x3e99999a;
      auVar254._28_4_ = 0x3e99999a;
      uVar21 = vcmpps_avx512vl(auVar100,auVar254,1);
      local_4e0._0_2_ = (short)uVar21;
      local_2e0 = vmaxps_avx(auVar102,auVar124);
      auVar100 = vminps_avx(local_2c0,auVar122);
      uVar21 = vcmpps_avx512vl(auVar102,auVar100,2);
      bVar59 = (byte)uVar21 & bVar54;
      uVar22 = vcmpps_avx512vl(local_2e0,local_2c0,2);
      if ((bVar54 & ((byte)uVar22 | (byte)uVar21)) == 0) {
        auVar243 = ZEXT3264(local_6a0);
      }
      else {
        auVar50._4_4_ = local_540._4_4_ * auVar269._4_4_;
        auVar50._0_4_ = local_540._0_4_ * auVar269._0_4_;
        auVar50._8_4_ = local_540._8_4_ * auVar269._8_4_;
        auVar50._12_4_ = local_540._12_4_ * auVar269._12_4_;
        auVar50._16_4_ = local_540._16_4_ * auVar269._16_4_;
        auVar50._20_4_ = local_540._20_4_ * auVar269._20_4_;
        auVar50._24_4_ = local_540._24_4_ * auVar269._24_4_;
        auVar50._28_4_ = auVar100._28_4_;
        auVar78 = vfmadd213ps_fma(auVar115,local_520,auVar50);
        auVar78 = vfmadd213ps_fma(auVar108,_local_500,ZEXT1632(auVar78));
        auVar100 = vandps_avx(ZEXT1632(auVar78),auVar262);
        uVar21 = vcmpps_avx512vl(auVar100,auVar254,1);
        bVar63 = (byte)uVar21 | ~bVar58;
        auVar158._8_4_ = 2;
        auVar158._0_8_ = 0x200000002;
        auVar158._12_4_ = 2;
        auVar158._16_4_ = 2;
        auVar158._20_4_ = 2;
        auVar158._24_4_ = 2;
        auVar158._28_4_ = 2;
        auVar39._8_4_ = 3;
        auVar39._0_8_ = 0x300000003;
        auVar39._12_4_ = 3;
        auVar39._16_4_ = 3;
        auVar39._20_4_ = 3;
        auVar39._24_4_ = 3;
        auVar39._28_4_ = 3;
        auVar100 = vpblendmd_avx512vl(auVar158,auVar39);
        local_280._0_4_ = (uint)(bVar63 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar63 & 1) * 2;
        bVar67 = (bool)(bVar63 >> 1 & 1);
        local_280._4_4_ = (uint)bVar67 * auVar100._4_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar63 >> 2 & 1);
        local_280._8_4_ = (uint)bVar67 * auVar100._8_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar63 >> 3 & 1);
        local_280._12_4_ = (uint)bVar67 * auVar100._12_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar63 >> 4 & 1);
        local_280._16_4_ = (uint)bVar67 * auVar100._16_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar63 >> 5 & 1);
        local_280._20_4_ = (uint)bVar67 * auVar100._20_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar63 >> 6 & 1);
        local_280._24_4_ = (uint)bVar67 * auVar100._24_4_ | (uint)!bVar67 * 2;
        local_280._28_4_ = (uint)(bVar63 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar63 >> 7) * 2;
        local_460 = vpbroadcastd_avx512vl();
        uVar21 = vpcmpd_avx512vl(local_460,local_280,5);
        bVar63 = (byte)uVar21 & bVar59;
        if (bVar63 == 0) {
          auVar160._4_4_ = uVar71;
          auVar160._0_4_ = uVar71;
          auVar160._8_4_ = uVar71;
          auVar160._12_4_ = uVar71;
          auVar160._16_4_ = uVar71;
          auVar160._20_4_ = uVar71;
          auVar160._24_4_ = uVar71;
          auVar160._28_4_ = uVar71;
          auVar100 = local_2e0;
        }
        else {
          local_2a0 = local_2e0;
          auVar79 = vminps_avx(local_620._0_16_,local_660._0_16_);
          auVar78 = vmaxps_avx(local_620._0_16_,local_660._0_16_);
          auVar17 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar80 = vminps_avx(auVar79,auVar17);
          auVar79 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar17 = vmaxps_avx(auVar78,auVar79);
          auVar190._8_4_ = 0x7fffffff;
          auVar190._0_8_ = 0x7fffffff7fffffff;
          auVar190._12_4_ = 0x7fffffff;
          auVar78 = vandps_avx(auVar80,auVar190);
          auVar79 = vandps_avx(auVar17,auVar190);
          auVar78 = vmaxps_avx(auVar78,auVar79);
          auVar79 = vmovshdup_avx(auVar78);
          auVar79 = vmaxss_avx(auVar79,auVar78);
          auVar78 = vshufpd_avx(auVar78,auVar78,1);
          auVar78 = vmaxss_avx(auVar78,auVar79);
          fVar163 = auVar78._0_4_ * 1.9073486e-06;
          local_700 = vshufps_avx(auVar17,auVar17,0xff);
          local_940 = auVar102._0_4_;
          fStack_93c = auVar102._4_4_;
          fStack_938 = auVar102._8_4_;
          fStack_934 = auVar102._12_4_;
          fStack_930 = auVar102._16_4_;
          fStack_92c = auVar102._20_4_;
          fStack_928 = auVar102._24_4_;
          fStack_924 = auVar102._28_4_;
          local_4c0 = local_940 + fVar162;
          fStack_4bc = fStack_93c + fVar162;
          fStack_4b8 = fStack_938 + fVar162;
          fStack_4b4 = fStack_934 + fVar162;
          fStack_4b0 = fStack_930 + fVar162;
          fStack_4ac = fStack_92c + fVar162;
          fStack_4a8 = fStack_928 + fVar162;
          fStack_4a4 = fStack_924 + fVar162;
          do {
            auVar159._8_4_ = 0x7f800000;
            auVar159._0_8_ = 0x7f8000007f800000;
            auVar159._12_4_ = 0x7f800000;
            auVar159._16_4_ = 0x7f800000;
            auVar159._20_4_ = 0x7f800000;
            auVar159._24_4_ = 0x7f800000;
            auVar159._28_4_ = 0x7f800000;
            auVar100 = vblendmps_avx512vl(auVar159,auVar102);
            auVar134._0_4_ =
                 (uint)(bVar63 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
            bVar67 = (bool)(bVar63 >> 1 & 1);
            auVar134._4_4_ = (uint)bVar67 * auVar100._4_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar63 >> 2 & 1);
            auVar134._8_4_ = (uint)bVar67 * auVar100._8_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar63 >> 3 & 1);
            auVar134._12_4_ = (uint)bVar67 * auVar100._12_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar63 >> 4 & 1);
            auVar134._16_4_ = (uint)bVar67 * auVar100._16_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar63 >> 5 & 1);
            auVar134._20_4_ = (uint)bVar67 * auVar100._20_4_ | (uint)!bVar67 * 0x7f800000;
            auVar134._24_4_ =
                 (uint)(bVar63 >> 6) * auVar100._24_4_ | (uint)!(bool)(bVar63 >> 6) * 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar100 = vshufps_avx(auVar134,auVar134,0xb1);
            auVar100 = vminps_avx(auVar134,auVar100);
            auVar104 = vshufpd_avx(auVar100,auVar100,5);
            auVar100 = vminps_avx(auVar100,auVar104);
            auVar104 = vpermpd_avx2(auVar100,0x4e);
            auVar100 = vminps_avx(auVar100,auVar104);
            uVar21 = vcmpps_avx512vl(auVar134,auVar100,0);
            bVar55 = (byte)uVar21 & bVar63;
            bVar56 = bVar63;
            if (bVar55 != 0) {
              bVar56 = bVar55;
            }
            iVar24 = 0;
            for (uVar71 = (uint)bVar56; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar24 = iVar24 + 1;
            }
            uVar71 = *(uint *)(local_1e0 + (uint)(iVar24 << 2));
            uVar70 = *(uint *)(local_1c0 + (uint)(iVar24 << 2));
            fVar179 = auVar75._0_4_;
            if ((float)local_7a0._0_4_ < 0.0) {
              fVar179 = sqrtf((float)local_7a0._0_4_);
            }
            auVar78 = vinsertps_avx(ZEXT416(uVar70),ZEXT416(uVar71),0x10);
            bVar67 = true;
            uVar69 = 0;
            do {
              uVar164 = auVar78._0_4_;
              auVar149._4_4_ = uVar164;
              auVar149._0_4_ = uVar164;
              auVar149._8_4_ = uVar164;
              auVar149._12_4_ = uVar164;
              auVar17 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_790);
              auVar79 = vmovshdup_avx(auVar78);
              local_5a0._0_16_ = auVar79;
              fVar184 = 1.0 - auVar79._0_4_;
              auVar79 = vshufps_avx(auVar78,auVar78,0x55);
              fVar180 = auVar79._0_4_;
              auVar191._0_4_ = local_660._0_4_ * fVar180;
              fVar181 = auVar79._4_4_;
              auVar191._4_4_ = local_660._4_4_ * fVar181;
              fVar183 = auVar79._8_4_;
              auVar191._8_4_ = local_660._8_4_ * fVar183;
              fVar182 = auVar79._12_4_;
              auVar191._12_4_ = local_660._12_4_ * fVar182;
              _local_580 = ZEXT416((uint)fVar184);
              auVar219._4_4_ = fVar184;
              auVar219._0_4_ = fVar184;
              auVar219._8_4_ = fVar184;
              auVar219._12_4_ = fVar184;
              auVar79 = vfmadd231ps_fma(auVar191,auVar219,local_620._0_16_);
              auVar235._0_4_ = local_640._0_4_ * fVar180;
              auVar235._4_4_ = local_640._4_4_ * fVar181;
              auVar235._8_4_ = local_640._8_4_ * fVar183;
              auVar235._12_4_ = local_640._12_4_ * fVar182;
              auVar80 = vfmadd231ps_fma(auVar235,auVar219,local_660._0_16_);
              auVar249._0_4_ = fVar180 * (float)local_680._0_4_;
              auVar249._4_4_ = fVar181 * (float)local_680._4_4_;
              auVar249._8_4_ = fVar183 * fStack_678;
              auVar249._12_4_ = fVar182 * fStack_674;
              auVar81 = vfmadd231ps_fma(auVar249,auVar219,local_640._0_16_);
              auVar260._0_4_ = fVar180 * auVar80._0_4_;
              auVar260._4_4_ = fVar181 * auVar80._4_4_;
              auVar260._8_4_ = fVar183 * auVar80._8_4_;
              auVar260._12_4_ = fVar182 * auVar80._12_4_;
              auVar79 = vfmadd231ps_fma(auVar260,auVar219,auVar79);
              auVar192._0_4_ = fVar180 * auVar81._0_4_;
              auVar192._4_4_ = fVar181 * auVar81._4_4_;
              auVar192._8_4_ = fVar183 * auVar81._8_4_;
              auVar192._12_4_ = fVar182 * auVar81._12_4_;
              auVar80 = vfmadd231ps_fma(auVar192,auVar219,auVar80);
              auVar236._0_4_ = fVar180 * auVar80._0_4_;
              auVar236._4_4_ = fVar181 * auVar80._4_4_;
              auVar236._8_4_ = fVar183 * auVar80._8_4_;
              auVar236._12_4_ = fVar182 * auVar80._12_4_;
              auVar81 = vfmadd231ps_fma(auVar236,auVar79,auVar219);
              auVar79 = vsubps_avx(auVar80,auVar79);
              auVar28._8_4_ = 0x40400000;
              auVar28._0_8_ = 0x4040000040400000;
              auVar28._12_4_ = 0x40400000;
              auVar80 = vmulps_avx512vl(auVar79,auVar28);
              local_560._0_16_ = auVar81;
              auVar17 = vsubps_avx(auVar17,auVar81);
              auVar79 = vdpps_avx(auVar17,auVar17,0x7f);
              fVar180 = auVar79._0_4_;
              local_760 = ZEXT1632(auVar78);
              if (fVar180 < 0.0) {
                auVar243._0_4_ = sqrtf(fVar180);
                auVar243._4_60_ = extraout_var;
                auVar78 = auVar243._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar79,auVar79);
              }
              local_5c0._0_16_ = vdpps_avx(auVar80,auVar80,0x7f);
              fVar181 = local_5c0._0_4_;
              auVar193._4_12_ = ZEXT812(0) << 0x20;
              auVar193._0_4_ = fVar181;
              local_7c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar193);
              fVar183 = local_7c0._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar193);
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(local_5c0._0_16_,auVar29);
              auVar81 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar81._0_4_;
              local_780._0_4_ = auVar78._0_4_;
              if (fVar181 < auVar77._0_4_) {
                fVar182 = sqrtf(fVar181);
                auVar78 = ZEXT416((uint)local_780._0_4_);
              }
              else {
                auVar81 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar182 = auVar81._0_4_;
              }
              fVar184 = local_7c0._0_4_;
              fVar181 = fVar183 * 1.5 + fVar181 * -0.5 * fVar184 * fVar184 * fVar184;
              auVar150._0_4_ = auVar80._0_4_ * fVar181;
              auVar150._4_4_ = auVar80._4_4_ * fVar181;
              auVar150._8_4_ = auVar80._8_4_ * fVar181;
              auVar150._12_4_ = auVar80._12_4_ * fVar181;
              local_7c0._0_16_ = vdpps_avx(auVar17,auVar150,0x7f);
              auVar77 = vaddss_avx512f(auVar78,ZEXT416(0x3f800000));
              auVar151._0_4_ = local_7c0._0_4_ * local_7c0._0_4_;
              auVar151._4_4_ = local_7c0._4_4_ * local_7c0._4_4_;
              auVar151._8_4_ = local_7c0._8_4_ * local_7c0._8_4_;
              auVar151._12_4_ = local_7c0._12_4_ * local_7c0._12_4_;
              auVar79 = vsubps_avx(auVar79,auVar151);
              fVar183 = auVar79._0_4_;
              auVar169._4_12_ = ZEXT812(0) << 0x20;
              auVar169._0_4_ = fVar183;
              auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
              auVar82 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
              auVar83 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
              uVar68 = fVar183 == 0.0;
              uVar66 = fVar183 < 0.0;
              if ((bool)uVar66) {
                local_6c0._0_4_ = fVar182;
                local_6e0._0_4_ = auVar82._0_4_;
                local_6f0._4_4_ = fVar181;
                local_6f0._0_4_ = fVar181;
                fStack_6e8 = fVar181;
                fStack_6e4 = fVar181;
                local_6d0 = auVar81;
                fVar183 = sqrtf(fVar183);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar82 = ZEXT416((uint)local_6e0._0_4_);
                auVar78 = ZEXT416((uint)local_780._0_4_);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar81 = local_6d0;
                fVar181 = (float)local_6f0._0_4_;
                fVar184 = (float)local_6f0._4_4_;
                fVar185 = fStack_6e8;
                fVar271 = fStack_6e4;
                fVar182 = (float)local_6c0._0_4_;
              }
              else {
                auVar79 = vsqrtss_avx(auVar79,auVar79);
                fVar183 = auVar79._0_4_;
                fVar184 = fVar181;
                fVar185 = fVar181;
                fVar271 = fVar181;
              }
              auVar273 = ZEXT3264(local_7e0);
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_);
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580);
              fVar186 = auVar79._0_4_ * 6.0;
              fVar16 = local_5a0._0_4_ * 6.0;
              auVar220._0_4_ = fVar16 * (float)local_680._0_4_;
              auVar220._4_4_ = fVar16 * (float)local_680._4_4_;
              auVar220._8_4_ = fVar16 * fStack_678;
              auVar220._12_4_ = fVar16 * fStack_674;
              auVar194._4_4_ = fVar186;
              auVar194._0_4_ = fVar186;
              auVar194._8_4_ = fVar186;
              auVar194._12_4_ = fVar186;
              auVar79 = vfmadd132ps_fma(auVar194,auVar220,local_640._0_16_);
              fVar186 = auVar85._0_4_ * 6.0;
              auVar170._4_4_ = fVar186;
              auVar170._0_4_ = fVar186;
              auVar170._8_4_ = fVar186;
              auVar170._12_4_ = fVar186;
              auVar79 = vfmadd132ps_fma(auVar170,auVar79,local_660._0_16_);
              fVar186 = local_580._0_4_ * 6.0;
              auVar195._4_4_ = fVar186;
              auVar195._0_4_ = fVar186;
              auVar195._8_4_ = fVar186;
              auVar195._12_4_ = fVar186;
              auVar79 = vfmadd132ps_fma(auVar195,auVar79,local_620._0_16_);
              auVar171._0_4_ = auVar79._0_4_ * (float)local_5c0._0_4_;
              auVar171._4_4_ = auVar79._4_4_ * (float)local_5c0._0_4_;
              auVar171._8_4_ = auVar79._8_4_ * (float)local_5c0._0_4_;
              auVar171._12_4_ = auVar79._12_4_ * (float)local_5c0._0_4_;
              auVar79 = vdpps_avx(auVar80,auVar79,0x7f);
              fVar186 = auVar79._0_4_;
              auVar196._0_4_ = auVar80._0_4_ * fVar186;
              auVar196._4_4_ = auVar80._4_4_ * fVar186;
              auVar196._8_4_ = auVar80._8_4_ * fVar186;
              auVar196._12_4_ = auVar80._12_4_ * fVar186;
              auVar79 = vsubps_avx(auVar171,auVar196);
              fVar186 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar85 = vmaxss_avx(ZEXT416((uint)fVar163),
                                   ZEXT416((uint)(local_760._0_4_ * fVar179 * 1.9073486e-06)));
              auVar30._8_4_ = 0x80000000;
              auVar30._0_8_ = 0x8000000080000000;
              auVar30._12_4_ = 0x80000000;
              auVar84 = vxorps_avx512vl(auVar80,auVar30);
              auVar197._0_4_ = fVar181 * auVar79._0_4_ * fVar186;
              auVar197._4_4_ = fVar184 * auVar79._4_4_ * fVar186;
              auVar197._8_4_ = fVar185 * auVar79._8_4_ * fVar186;
              auVar197._12_4_ = fVar271 * auVar79._12_4_ * fVar186;
              auVar79 = vdpps_avx(auVar84,auVar150,0x7f);
              auVar86 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar163),auVar85);
              auVar78 = vdpps_avx(auVar17,auVar197,0x7f);
              vfmadd213ss_avx512f(auVar77,ZEXT416((uint)(fVar163 / fVar182)),auVar86);
              fVar181 = auVar79._0_4_ + auVar78._0_4_;
              auVar78 = vdpps_avx(local_790,auVar150,0x7f);
              auVar79 = vdpps_avx(auVar17,auVar84,0x7f);
              auVar77 = vmulss_avx512f(auVar83,auVar81);
              auVar81 = vmulss_avx512f(auVar81,auVar81);
              auVar82 = vaddss_avx512f(auVar82,ZEXT416((uint)(auVar77._0_4_ * auVar81._0_4_)));
              auVar81 = vdpps_avx(auVar17,local_790,0x7f);
              auVar83 = vfnmadd231ss_avx512f(auVar79,local_7c0._0_16_,ZEXT416((uint)fVar181));
              auVar81 = vfnmadd231ss_avx512f(auVar81,local_7c0._0_16_,auVar78);
              auVar79 = vpermilps_avx(local_560._0_16_,0xff);
              fVar183 = fVar183 - auVar79._0_4_;
              auVar77 = vshufps_avx(auVar80,auVar80,0xff);
              auVar79 = vfmsub213ss_fma(auVar83,auVar82,auVar77);
              auVar265._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
              auVar265._8_4_ = auVar79._8_4_ ^ 0x80000000;
              auVar265._12_4_ = auVar79._12_4_ ^ 0x80000000;
              auVar81 = ZEXT416((uint)(auVar81._0_4_ * auVar82._0_4_));
              auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar79._0_4_)),
                                        ZEXT416((uint)fVar181),auVar81);
              auVar79 = vinsertps_avx(auVar265,auVar81,0x1c);
              auVar250._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
              auVar250._8_4_ = auVar78._8_4_ ^ 0x80000000;
              auVar250._12_4_ = auVar78._12_4_ ^ 0x80000000;
              auVar81 = vinsertps_avx(ZEXT416((uint)fVar181),auVar250,0x10);
              auVar221._0_4_ = auVar82._0_4_;
              auVar221._4_4_ = auVar221._0_4_;
              auVar221._8_4_ = auVar221._0_4_;
              auVar221._12_4_ = auVar221._0_4_;
              auVar78 = vdivps_avx(auVar79,auVar221);
              auVar79 = vdivps_avx(auVar81,auVar221);
              auVar81 = vbroadcastss_avx512vl(local_7c0._0_16_);
              auVar222._0_4_ = auVar81._0_4_ * auVar78._0_4_ + fVar183 * auVar79._0_4_;
              auVar222._4_4_ = auVar81._4_4_ * auVar78._4_4_ + fVar183 * auVar79._4_4_;
              auVar222._8_4_ = auVar81._8_4_ * auVar78._8_4_ + fVar183 * auVar79._8_4_;
              auVar222._12_4_ = auVar81._12_4_ * auVar78._12_4_ + fVar183 * auVar79._12_4_;
              auVar78 = vsubps_avx(local_760._0_16_,auVar222);
              auVar31._8_4_ = 0x7fffffff;
              auVar31._0_8_ = 0x7fffffff7fffffff;
              auVar31._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(local_7c0._0_16_,auVar31);
              auVar79 = vucomiss_avx512f(auVar79);
              if (!(bool)uVar66 && !(bool)uVar68) {
                auVar79 = vaddss_avx512f(auVar85,auVar79);
                auVar79 = vfmadd231ss_fma(auVar79,local_700,ZEXT416(0x36000000));
                auVar32._8_4_ = 0x7fffffff;
                auVar32._0_8_ = 0x7fffffff7fffffff;
                auVar32._12_4_ = 0x7fffffff;
                auVar81 = vandps_avx512vl(ZEXT416((uint)fVar183),auVar32);
                if (auVar81._0_4_ < auVar79._0_4_) {
                  fVar179 = auVar78._0_4_ + (float)local_710._0_4_;
                  if (fVar179 < fVar144) {
LAB_01b7055a:
                    bVar56 = 0;
                    goto LAB_01b7057d;
                  }
                  fVar181 = *(float *)(ray + k * 4 + 0x100);
                  if (fVar179 <= fVar181) {
                    auVar79 = vmovshdup_avx(auVar78);
                    bVar56 = 0;
                    if ((auVar79._0_4_ < 0.0) || (1.0 < auVar79._0_4_)) goto LAB_01b7057d;
                    auVar223._0_12_ = ZEXT812(0);
                    auVar223._12_4_ = 0;
                    auVar198._4_8_ = auVar223._4_8_;
                    auVar198._0_4_ = fVar180;
                    auVar198._12_4_ = 0;
                    auVar79 = vrsqrt14ss_avx512f(auVar223,auVar198);
                    fVar183 = auVar79._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar60].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01b7055a;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar56 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01b7057d;
                    fVar180 = fVar183 * 1.5 + fVar180 * -0.5 * fVar183 * fVar183 * fVar183;
                    auVar199._0_4_ = auVar17._0_4_ * fVar180;
                    auVar199._4_4_ = auVar17._4_4_ * fVar180;
                    auVar199._8_4_ = auVar17._8_4_ * fVar180;
                    auVar199._12_4_ = auVar17._12_4_ * fVar180;
                    auVar81 = vfmadd213ps_fma(auVar77,auVar199,auVar80);
                    auVar79 = vshufps_avx(auVar199,auVar199,0xc9);
                    auVar17 = vshufps_avx(auVar80,auVar80,0xc9);
                    auVar200._0_4_ = auVar199._0_4_ * auVar17._0_4_;
                    auVar200._4_4_ = auVar199._4_4_ * auVar17._4_4_;
                    auVar200._8_4_ = auVar199._8_4_ * auVar17._8_4_;
                    auVar200._12_4_ = auVar199._12_4_ * auVar17._12_4_;
                    auVar80 = vfmsub231ps_fma(auVar200,auVar80,auVar79);
                    auVar79 = vshufps_avx(auVar80,auVar80,0xc9);
                    auVar17 = vshufps_avx(auVar81,auVar81,0xc9);
                    auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                    auVar152._0_4_ = auVar81._0_4_ * auVar80._0_4_;
                    auVar152._4_4_ = auVar81._4_4_ * auVar80._4_4_;
                    auVar152._8_4_ = auVar81._8_4_ * auVar80._8_4_;
                    auVar152._12_4_ = auVar81._12_4_ * auVar80._12_4_;
                    auVar79 = vfmsub231ps_fma(auVar152,auVar79,auVar17);
                    auVar230._8_4_ = 1;
                    auVar230._0_8_ = 0x100000001;
                    auVar230._12_4_ = 1;
                    auVar230._16_4_ = 1;
                    auVar230._20_4_ = 1;
                    auVar230._24_4_ = 1;
                    auVar230._28_4_ = 1;
                    local_3a0 = vpermps_avx2(auVar230,ZEXT1632(auVar78));
                    auVar100 = vpermps_avx2(auVar230,ZEXT1632(auVar79));
                    auVar241._8_4_ = 2;
                    auVar241._0_8_ = 0x200000002;
                    auVar241._12_4_ = 2;
                    auVar241._16_4_ = 2;
                    auVar241._20_4_ = 2;
                    auVar241._24_4_ = 2;
                    auVar241._28_4_ = 2;
                    local_3e0 = vpermps_avx2(auVar241,ZEXT1632(auVar79));
                    local_3c0 = auVar79._0_4_;
                    local_400[0] = (RTCHitN)auVar100[0];
                    local_400[1] = (RTCHitN)auVar100[1];
                    local_400[2] = (RTCHitN)auVar100[2];
                    local_400[3] = (RTCHitN)auVar100[3];
                    local_400[4] = (RTCHitN)auVar100[4];
                    local_400[5] = (RTCHitN)auVar100[5];
                    local_400[6] = (RTCHitN)auVar100[6];
                    local_400[7] = (RTCHitN)auVar100[7];
                    local_400[8] = (RTCHitN)auVar100[8];
                    local_400[9] = (RTCHitN)auVar100[9];
                    local_400[10] = (RTCHitN)auVar100[10];
                    local_400[0xb] = (RTCHitN)auVar100[0xb];
                    local_400[0xc] = (RTCHitN)auVar100[0xc];
                    local_400[0xd] = (RTCHitN)auVar100[0xd];
                    local_400[0xe] = (RTCHitN)auVar100[0xe];
                    local_400[0xf] = (RTCHitN)auVar100[0xf];
                    local_400[0x10] = (RTCHitN)auVar100[0x10];
                    local_400[0x11] = (RTCHitN)auVar100[0x11];
                    local_400[0x12] = (RTCHitN)auVar100[0x12];
                    local_400[0x13] = (RTCHitN)auVar100[0x13];
                    local_400[0x14] = (RTCHitN)auVar100[0x14];
                    local_400[0x15] = (RTCHitN)auVar100[0x15];
                    local_400[0x16] = (RTCHitN)auVar100[0x16];
                    local_400[0x17] = (RTCHitN)auVar100[0x17];
                    local_400[0x18] = (RTCHitN)auVar100[0x18];
                    local_400[0x19] = (RTCHitN)auVar100[0x19];
                    local_400[0x1a] = (RTCHitN)auVar100[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar100[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar100[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar100[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar100[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar100[0x1f];
                    uStack_3bc = local_3c0;
                    uStack_3b8 = local_3c0;
                    uStack_3b4 = local_3c0;
                    uStack_3b0 = local_3c0;
                    uStack_3ac = local_3c0;
                    uStack_3a8 = local_3c0;
                    uStack_3a4 = local_3c0;
                    local_380 = ZEXT432(0) << 0x20;
                    local_360 = local_420._0_8_;
                    uStack_358 = local_420._8_8_;
                    uStack_350 = local_420._16_8_;
                    uStack_348 = local_420._24_8_;
                    local_340 = local_440;
                    vpcmpeqd_avx2(local_440,local_440);
                    local_320 = context->user->instID[0];
                    uStack_31c = local_320;
                    uStack_318 = local_320;
                    uStack_314 = local_320;
                    uStack_310 = local_320;
                    uStack_30c = local_320;
                    uStack_308 = local_320;
                    uStack_304 = local_320;
                    local_300 = context->user->instPrimID[0];
                    uStack_2fc = local_300;
                    uStack_2f8 = local_300;
                    uStack_2f4 = local_300;
                    uStack_2f0 = local_300;
                    uStack_2ec = local_300;
                    uStack_2e8 = local_300;
                    uStack_2e4 = local_300;
                    *(float *)(ray + k * 4 + 0x100) = fVar179;
                    local_740 = local_480;
                    local_810.valid = (int *)local_740;
                    local_810.geometryUserPtr = pGVar3->userPtr;
                    local_810.context = context->user;
                    local_810.hit = local_400;
                    local_810.N = 8;
                    local_810.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&local_810);
                      auVar273 = ZEXT3264(local_7e0);
                    }
                    if (local_740 != (undefined1  [32])0x0) {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var7)(&local_810);
                        auVar273 = ZEXT3264(local_7e0);
                      }
                      uVar69 = vptestmd_avx512vl(local_740,local_740);
                      auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar8 = (bool)((byte)uVar69 & 1);
                      bVar9 = (bool)((byte)(uVar69 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar69 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
                      bVar15 = SUB81(uVar69 >> 7,0);
                      *(uint *)(local_810.ray + 0x100) =
                           (uint)bVar8 * auVar100._0_4_ |
                           (uint)!bVar8 * *(int *)(local_810.ray + 0x100);
                      *(uint *)(local_810.ray + 0x104) =
                           (uint)bVar9 * auVar100._4_4_ |
                           (uint)!bVar9 * *(int *)(local_810.ray + 0x104);
                      *(uint *)(local_810.ray + 0x108) =
                           (uint)bVar10 * auVar100._8_4_ |
                           (uint)!bVar10 * *(int *)(local_810.ray + 0x108);
                      *(uint *)(local_810.ray + 0x10c) =
                           (uint)bVar11 * auVar100._12_4_ |
                           (uint)!bVar11 * *(int *)(local_810.ray + 0x10c);
                      *(uint *)(local_810.ray + 0x110) =
                           (uint)bVar12 * auVar100._16_4_ |
                           (uint)!bVar12 * *(int *)(local_810.ray + 0x110);
                      *(uint *)(local_810.ray + 0x114) =
                           (uint)bVar13 * auVar100._20_4_ |
                           (uint)!bVar13 * *(int *)(local_810.ray + 0x114);
                      *(uint *)(local_810.ray + 0x118) =
                           (uint)bVar14 * auVar100._24_4_ |
                           (uint)!bVar14 * *(int *)(local_810.ray + 0x118);
                      *(uint *)(local_810.ray + 0x11c) =
                           (uint)bVar15 * auVar100._28_4_ |
                           (uint)!bVar15 * *(int *)(local_810.ray + 0x11c);
                      bVar56 = 1;
                      if (local_740 != (undefined1  [32])0x0) goto LAB_01b7057d;
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar181;
                  }
                  bVar56 = 0;
                  goto LAB_01b7057d;
                }
              }
              bVar67 = uVar69 < 4;
              uVar69 = uVar69 + 1;
            } while (uVar69 != 5);
            bVar67 = false;
            bVar56 = 5;
LAB_01b7057d:
            bVar64 = (bool)(bVar64 | bVar67 & bVar56);
            uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar160._4_4_ = uVar164;
            auVar160._0_4_ = uVar164;
            auVar160._8_4_ = uVar164;
            auVar160._12_4_ = uVar164;
            auVar160._16_4_ = uVar164;
            auVar160._20_4_ = uVar164;
            auVar160._24_4_ = uVar164;
            auVar160._28_4_ = uVar164;
            auVar52._4_4_ = fStack_4bc;
            auVar52._0_4_ = local_4c0;
            auVar52._8_4_ = fStack_4b8;
            auVar52._12_4_ = fStack_4b4;
            auVar52._16_4_ = fStack_4b0;
            auVar52._20_4_ = fStack_4ac;
            auVar52._24_4_ = fStack_4a8;
            auVar52._28_4_ = fStack_4a4;
            uVar21 = vcmpps_avx512vl(auVar160,auVar52,0xd);
            bVar63 = ~('\x01' << ((byte)iVar24 & 0x1f)) & bVar63 & (byte)uVar21;
            auVar100 = local_2a0;
          } while (bVar63 != 0);
        }
        auVar102 = local_2e0;
        bVar58 = local_4e0[0] | ~bVar58;
        auVar177._0_4_ = fVar162 + auVar100._0_4_;
        auVar177._4_4_ = fVar162 + auVar100._4_4_;
        auVar177._8_4_ = fVar162 + auVar100._8_4_;
        auVar177._12_4_ = fVar162 + auVar100._12_4_;
        auVar177._16_4_ = fVar162 + auVar100._16_4_;
        auVar177._20_4_ = fVar162 + auVar100._20_4_;
        auVar177._24_4_ = fVar162 + auVar100._24_4_;
        auVar177._28_4_ = fVar162 + auVar100._28_4_;
        uVar21 = vcmpps_avx512vl(auVar177,auVar160,2);
        bVar54 = (byte)uVar22 & bVar54 & (byte)uVar21;
        auVar178._8_4_ = 2;
        auVar178._0_8_ = 0x200000002;
        auVar178._12_4_ = 2;
        auVar178._16_4_ = 2;
        auVar178._20_4_ = 2;
        auVar178._24_4_ = 2;
        auVar178._28_4_ = 2;
        auVar40._8_4_ = 3;
        auVar40._0_8_ = 0x300000003;
        auVar40._12_4_ = 3;
        auVar40._16_4_ = 3;
        auVar40._20_4_ = 3;
        auVar40._24_4_ = 3;
        auVar40._28_4_ = 3;
        auVar100 = vpblendmd_avx512vl(auVar178,auVar40);
        auVar135._0_4_ = (uint)(bVar58 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar58 & 1) * 2;
        bVar67 = (bool)(bVar58 >> 1 & 1);
        auVar135._4_4_ = (uint)bVar67 * auVar100._4_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar58 >> 2 & 1);
        auVar135._8_4_ = (uint)bVar67 * auVar100._8_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar58 >> 3 & 1);
        auVar135._12_4_ = (uint)bVar67 * auVar100._12_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar58 >> 4 & 1);
        auVar135._16_4_ = (uint)bVar67 * auVar100._16_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar58 >> 5 & 1);
        auVar135._20_4_ = (uint)bVar67 * auVar100._20_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar58 >> 6 & 1);
        auVar135._24_4_ = (uint)bVar67 * auVar100._24_4_ | (uint)!bVar67 * 2;
        auVar135._28_4_ = (uint)(bVar58 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar58 >> 7) * 2;
        uVar21 = vpcmpd_avx512vl(local_460,auVar135,5);
        bVar58 = (byte)uVar21 & bVar54;
        if (bVar58 != 0) {
          auVar79 = vminps_avx(local_620._0_16_,local_660._0_16_);
          auVar78 = vmaxps_avx(local_620._0_16_,local_660._0_16_);
          auVar17 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar80 = vminps_avx(auVar79,auVar17);
          auVar79 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar17 = vmaxps_avx(auVar78,auVar79);
          auVar201._8_4_ = 0x7fffffff;
          auVar201._0_8_ = 0x7fffffff7fffffff;
          auVar201._12_4_ = 0x7fffffff;
          auVar78 = vandps_avx(auVar80,auVar201);
          auVar79 = vandps_avx(auVar17,auVar201);
          auVar78 = vmaxps_avx(auVar78,auVar79);
          auVar79 = vmovshdup_avx(auVar78);
          auVar79 = vmaxss_avx(auVar79,auVar78);
          auVar78 = vshufpd_avx(auVar78,auVar78,1);
          auVar78 = vmaxss_avx(auVar78,auVar79);
          fVar163 = auVar78._0_4_ * 1.9073486e-06;
          local_700 = vshufps_avx(auVar17,auVar17,0xff);
          local_4c0 = fVar162 + local_2e0._0_4_;
          fStack_4bc = fVar162 + local_2e0._4_4_;
          fStack_4b8 = fVar162 + local_2e0._8_4_;
          fStack_4b4 = fVar162 + local_2e0._12_4_;
          fStack_4b0 = fVar162 + local_2e0._16_4_;
          fStack_4ac = fVar162 + local_2e0._20_4_;
          fStack_4a8 = fVar162 + local_2e0._24_4_;
          fStack_4a4 = fVar162 + local_2e0._28_4_;
          local_4e0 = auVar135;
          do {
            auVar161._8_4_ = 0x7f800000;
            auVar161._0_8_ = 0x7f8000007f800000;
            auVar161._12_4_ = 0x7f800000;
            auVar161._16_4_ = 0x7f800000;
            auVar161._20_4_ = 0x7f800000;
            auVar161._24_4_ = 0x7f800000;
            auVar161._28_4_ = 0x7f800000;
            auVar100 = vblendmps_avx512vl(auVar161,auVar102);
            auVar136._0_4_ =
                 (uint)(bVar58 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar58 & 1) * 0x7f800000;
            bVar67 = (bool)(bVar58 >> 1 & 1);
            auVar136._4_4_ = (uint)bVar67 * auVar100._4_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar58 >> 2 & 1);
            auVar136._8_4_ = (uint)bVar67 * auVar100._8_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar58 >> 3 & 1);
            auVar136._12_4_ = (uint)bVar67 * auVar100._12_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar58 >> 4 & 1);
            auVar136._16_4_ = (uint)bVar67 * auVar100._16_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar58 >> 5 & 1);
            auVar136._20_4_ = (uint)bVar67 * auVar100._20_4_ | (uint)!bVar67 * 0x7f800000;
            auVar136._24_4_ =
                 (uint)(bVar58 >> 6) * auVar100._24_4_ | (uint)!(bool)(bVar58 >> 6) * 0x7f800000;
            auVar136._28_4_ = 0x7f800000;
            auVar100 = vshufps_avx(auVar136,auVar136,0xb1);
            auVar100 = vminps_avx(auVar136,auVar100);
            auVar104 = vshufpd_avx(auVar100,auVar100,5);
            auVar100 = vminps_avx(auVar100,auVar104);
            auVar104 = vpermpd_avx2(auVar100,0x4e);
            auVar100 = vminps_avx(auVar100,auVar104);
            uVar21 = vcmpps_avx512vl(auVar136,auVar100,0);
            bVar56 = (byte)uVar21 & bVar58;
            bVar63 = bVar58;
            if (bVar56 != 0) {
              bVar63 = bVar56;
            }
            iVar24 = 0;
            for (uVar71 = (uint)bVar63; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar24 = iVar24 + 1;
            }
            uVar71 = *(uint *)(local_200 + (uint)(iVar24 << 2));
            uVar70 = *(uint *)(local_2c0 + (uint)(iVar24 << 2));
            fVar179 = auVar76._0_4_;
            if ((float)local_7a0._0_4_ < 0.0) {
              fVar179 = sqrtf((float)local_7a0._0_4_);
            }
            auVar78 = vinsertps_avx(ZEXT416(uVar70),ZEXT416(uVar71),0x10);
            bVar67 = true;
            uVar69 = 0;
            do {
              uVar164 = auVar78._0_4_;
              auVar153._4_4_ = uVar164;
              auVar153._0_4_ = uVar164;
              auVar153._8_4_ = uVar164;
              auVar153._12_4_ = uVar164;
              auVar17 = vfmadd132ps_fma(auVar153,ZEXT816(0) << 0x40,local_790);
              auVar79 = vmovshdup_avx(auVar78);
              local_5a0._0_16_ = auVar79;
              fVar184 = 1.0 - auVar79._0_4_;
              auVar79 = vshufps_avx(auVar78,auVar78,0x55);
              fVar180 = auVar79._0_4_;
              auVar202._0_4_ = local_660._0_4_ * fVar180;
              fVar181 = auVar79._4_4_;
              auVar202._4_4_ = local_660._4_4_ * fVar181;
              fVar183 = auVar79._8_4_;
              auVar202._8_4_ = local_660._8_4_ * fVar183;
              fVar182 = auVar79._12_4_;
              auVar202._12_4_ = local_660._12_4_ * fVar182;
              _local_580 = ZEXT416((uint)fVar184);
              auVar224._4_4_ = fVar184;
              auVar224._0_4_ = fVar184;
              auVar224._8_4_ = fVar184;
              auVar224._12_4_ = fVar184;
              auVar79 = vfmadd231ps_fma(auVar202,auVar224,local_620._0_16_);
              auVar237._0_4_ = local_640._0_4_ * fVar180;
              auVar237._4_4_ = local_640._4_4_ * fVar181;
              auVar237._8_4_ = local_640._8_4_ * fVar183;
              auVar237._12_4_ = local_640._12_4_ * fVar182;
              auVar80 = vfmadd231ps_fma(auVar237,auVar224,local_660._0_16_);
              auVar251._0_4_ = fVar180 * (float)local_680._0_4_;
              auVar251._4_4_ = fVar181 * (float)local_680._4_4_;
              auVar251._8_4_ = fVar183 * fStack_678;
              auVar251._12_4_ = fVar182 * fStack_674;
              auVar81 = vfmadd231ps_fma(auVar251,auVar224,local_640._0_16_);
              auVar261._0_4_ = fVar180 * auVar80._0_4_;
              auVar261._4_4_ = fVar181 * auVar80._4_4_;
              auVar261._8_4_ = fVar183 * auVar80._8_4_;
              auVar261._12_4_ = fVar182 * auVar80._12_4_;
              auVar79 = vfmadd231ps_fma(auVar261,auVar224,auVar79);
              auVar203._0_4_ = fVar180 * auVar81._0_4_;
              auVar203._4_4_ = fVar181 * auVar81._4_4_;
              auVar203._8_4_ = fVar183 * auVar81._8_4_;
              auVar203._12_4_ = fVar182 * auVar81._12_4_;
              auVar80 = vfmadd231ps_fma(auVar203,auVar224,auVar80);
              auVar238._0_4_ = fVar180 * auVar80._0_4_;
              auVar238._4_4_ = fVar181 * auVar80._4_4_;
              auVar238._8_4_ = fVar183 * auVar80._8_4_;
              auVar238._12_4_ = fVar182 * auVar80._12_4_;
              auVar81 = vfmadd231ps_fma(auVar238,auVar79,auVar224);
              auVar79 = vsubps_avx(auVar80,auVar79);
              auVar33._8_4_ = 0x40400000;
              auVar33._0_8_ = 0x4040000040400000;
              auVar33._12_4_ = 0x40400000;
              auVar80 = vmulps_avx512vl(auVar79,auVar33);
              local_560._0_16_ = auVar81;
              auVar17 = vsubps_avx(auVar17,auVar81);
              auVar79 = vdpps_avx(auVar17,auVar17,0x7f);
              fVar180 = auVar79._0_4_;
              local_760 = ZEXT1632(auVar78);
              if (fVar180 < 0.0) {
                auVar273._0_4_ = sqrtf(fVar180);
                auVar273._4_60_ = extraout_var_00;
                auVar78 = auVar273._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar79,auVar79);
              }
              local_5c0._0_16_ = vdpps_avx(auVar80,auVar80,0x7f);
              fVar181 = local_5c0._0_4_;
              auVar204._4_12_ = ZEXT812(0) << 0x20;
              auVar204._0_4_ = fVar181;
              local_7c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar204);
              fVar183 = local_7c0._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar204);
              auVar34._8_4_ = 0x80000000;
              auVar34._0_8_ = 0x8000000080000000;
              auVar34._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(local_5c0._0_16_,auVar34);
              auVar81 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar81._0_4_;
              local_780._0_4_ = auVar78._0_4_;
              if (fVar181 < auVar77._0_4_) {
                fVar182 = sqrtf(fVar181);
                auVar78 = ZEXT416((uint)local_780._0_4_);
              }
              else {
                auVar81 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar182 = auVar81._0_4_;
              }
              fVar184 = local_7c0._0_4_;
              auVar77 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar183 * 1.5 +
                                                 fVar181 * -0.5 * fVar184 * fVar184 * fVar184)));
              auVar81 = vmulps_avx512vl(auVar80,auVar77);
              local_7c0._0_16_ = vdpps_avx(auVar17,auVar81,0x7f);
              auVar83 = vaddss_avx512f(auVar78,ZEXT416(0x3f800000));
              auVar154._0_4_ = local_7c0._0_4_ * local_7c0._0_4_;
              auVar154._4_4_ = local_7c0._4_4_ * local_7c0._4_4_;
              auVar154._8_4_ = local_7c0._8_4_ * local_7c0._8_4_;
              auVar154._12_4_ = local_7c0._12_4_ * local_7c0._12_4_;
              auVar79 = vsubps_avx(auVar79,auVar154);
              fVar181 = auVar79._0_4_;
              auVar172._4_12_ = ZEXT812(0) << 0x20;
              auVar172._0_4_ = fVar181;
              auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar172);
              auVar85 = vmulss_avx512f(auVar82,ZEXT416(0x3fc00000));
              auVar86 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
              uVar68 = fVar181 == 0.0;
              uVar66 = fVar181 < 0.0;
              if ((bool)uVar66) {
                local_6d0._0_4_ = auVar85._0_4_;
                _local_6f0 = auVar77;
                local_6e0 = auVar81;
                local_6c0 = auVar82;
                fVar181 = sqrtf(fVar181);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar85 = ZEXT416((uint)local_6d0._0_4_);
                auVar78 = ZEXT416((uint)local_780._0_4_);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar81 = local_6e0;
                auVar82 = local_6c0;
                auVar77 = _local_6f0;
              }
              else {
                auVar79 = vsqrtss_avx(auVar79,auVar79);
                fVar181 = auVar79._0_4_;
              }
              auVar273 = ZEXT3264(local_7e0);
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_);
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580);
              fVar183 = auVar79._0_4_ * 6.0;
              fVar184 = local_5a0._0_4_ * 6.0;
              auVar225._0_4_ = fVar184 * (float)local_680._0_4_;
              auVar225._4_4_ = fVar184 * (float)local_680._4_4_;
              auVar225._8_4_ = fVar184 * fStack_678;
              auVar225._12_4_ = fVar184 * fStack_674;
              auVar205._4_4_ = fVar183;
              auVar205._0_4_ = fVar183;
              auVar205._8_4_ = fVar183;
              auVar205._12_4_ = fVar183;
              auVar79 = vfmadd132ps_fma(auVar205,auVar225,local_640._0_16_);
              fVar183 = auVar84._0_4_ * 6.0;
              auVar173._4_4_ = fVar183;
              auVar173._0_4_ = fVar183;
              auVar173._8_4_ = fVar183;
              auVar173._12_4_ = fVar183;
              auVar79 = vfmadd132ps_fma(auVar173,auVar79,local_660._0_16_);
              fVar183 = local_580._0_4_ * 6.0;
              auVar206._4_4_ = fVar183;
              auVar206._0_4_ = fVar183;
              auVar206._8_4_ = fVar183;
              auVar206._12_4_ = fVar183;
              auVar79 = vfmadd132ps_fma(auVar206,auVar79,local_620._0_16_);
              auVar174._0_4_ = auVar79._0_4_ * (float)local_5c0._0_4_;
              auVar174._4_4_ = auVar79._4_4_ * (float)local_5c0._0_4_;
              auVar174._8_4_ = auVar79._8_4_ * (float)local_5c0._0_4_;
              auVar174._12_4_ = auVar79._12_4_ * (float)local_5c0._0_4_;
              auVar79 = vdpps_avx(auVar80,auVar79,0x7f);
              fVar183 = auVar79._0_4_;
              auVar207._0_4_ = auVar80._0_4_ * fVar183;
              auVar207._4_4_ = auVar80._4_4_ * fVar183;
              auVar207._8_4_ = auVar80._8_4_ * fVar183;
              auVar207._12_4_ = auVar80._12_4_ * fVar183;
              auVar79 = vsubps_avx(auVar174,auVar207);
              fVar183 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar84 = vmaxss_avx(ZEXT416((uint)fVar163),
                                   ZEXT416((uint)(local_760._0_4_ * fVar179 * 1.9073486e-06)));
              auVar208._0_4_ = auVar79._0_4_ * fVar183;
              auVar208._4_4_ = auVar79._4_4_ * fVar183;
              auVar208._8_4_ = auVar79._8_4_ * fVar183;
              auVar208._12_4_ = auVar79._12_4_ * fVar183;
              auVar35._8_4_ = 0x80000000;
              auVar35._0_8_ = 0x8000000080000000;
              auVar35._12_4_ = 0x80000000;
              auVar87 = vxorps_avx512vl(auVar80,auVar35);
              auVar88 = vmulps_avx512vl(auVar77,auVar208);
              auVar79 = vdpps_avx(auVar87,auVar81,0x7f);
              auVar77 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar163),auVar84);
              auVar78 = vdpps_avx(auVar17,auVar88,0x7f);
              vfmadd213ss_avx512f(auVar83,ZEXT416((uint)(fVar163 / fVar182)),auVar77);
              fVar183 = auVar79._0_4_ + auVar78._0_4_;
              auVar78 = vdpps_avx(local_790,auVar81,0x7f);
              auVar79 = vdpps_avx(auVar17,auVar87,0x7f);
              auVar81 = vmulss_avx512f(auVar86,auVar82);
              auVar77 = vmulss_avx512f(auVar82,auVar82);
              auVar82 = vaddss_avx512f(auVar85,ZEXT416((uint)(auVar81._0_4_ * auVar77._0_4_)));
              auVar81 = vdpps_avx(auVar17,local_790,0x7f);
              auVar83 = vfnmadd231ss_avx512f(auVar79,local_7c0._0_16_,ZEXT416((uint)fVar183));
              auVar81 = vfnmadd231ss_avx512f(auVar81,local_7c0._0_16_,auVar78);
              auVar79 = vpermilps_avx(local_560._0_16_,0xff);
              fVar181 = fVar181 - auVar79._0_4_;
              auVar77 = vshufps_avx(auVar80,auVar80,0xff);
              auVar79 = vfmsub213ss_fma(auVar83,auVar82,auVar77);
              auVar266._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
              auVar266._8_4_ = auVar79._8_4_ ^ 0x80000000;
              auVar266._12_4_ = auVar79._12_4_ ^ 0x80000000;
              auVar81 = ZEXT416((uint)(auVar81._0_4_ * auVar82._0_4_));
              auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar79._0_4_)),
                                        ZEXT416((uint)fVar183),auVar81);
              auVar79 = vinsertps_avx(auVar266,auVar81,0x1c);
              auVar252._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
              auVar252._8_4_ = auVar78._8_4_ ^ 0x80000000;
              auVar252._12_4_ = auVar78._12_4_ ^ 0x80000000;
              auVar81 = vinsertps_avx(ZEXT416((uint)fVar183),auVar252,0x10);
              auVar226._0_4_ = auVar82._0_4_;
              auVar226._4_4_ = auVar226._0_4_;
              auVar226._8_4_ = auVar226._0_4_;
              auVar226._12_4_ = auVar226._0_4_;
              auVar78 = vdivps_avx(auVar79,auVar226);
              auVar79 = vdivps_avx(auVar81,auVar226);
              auVar81 = vbroadcastss_avx512vl(local_7c0._0_16_);
              auVar227._0_4_ = auVar81._0_4_ * auVar78._0_4_ + fVar181 * auVar79._0_4_;
              auVar227._4_4_ = auVar81._4_4_ * auVar78._4_4_ + fVar181 * auVar79._4_4_;
              auVar227._8_4_ = auVar81._8_4_ * auVar78._8_4_ + fVar181 * auVar79._8_4_;
              auVar227._12_4_ = auVar81._12_4_ * auVar78._12_4_ + fVar181 * auVar79._12_4_;
              auVar78 = vsubps_avx(local_760._0_16_,auVar227);
              auVar36._8_4_ = 0x7fffffff;
              auVar36._0_8_ = 0x7fffffff7fffffff;
              auVar36._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(local_7c0._0_16_,auVar36);
              auVar79 = vucomiss_avx512f(auVar79);
              if (!(bool)uVar66 && !(bool)uVar68) {
                auVar79 = vaddss_avx512f(auVar84,auVar79);
                auVar79 = vfmadd231ss_fma(auVar79,local_700,ZEXT416(0x36000000));
                auVar37._8_4_ = 0x7fffffff;
                auVar37._0_8_ = 0x7fffffff7fffffff;
                auVar37._12_4_ = 0x7fffffff;
                auVar81 = vandps_avx512vl(ZEXT416((uint)fVar181),auVar37);
                if (auVar81._0_4_ < auVar79._0_4_) {
                  fVar179 = auVar78._0_4_ + (float)local_710._0_4_;
                  if (fVar179 < fVar144) {
LAB_01b71161:
                    bVar63 = 0;
                    goto LAB_01b71170;
                  }
                  fVar181 = *(float *)(ray + k * 4 + 0x100);
                  if (fVar179 <= fVar181) {
                    auVar79 = vmovshdup_avx(auVar78);
                    bVar63 = 0;
                    if ((auVar79._0_4_ < 0.0) || (bVar63 = 0, 1.0 < auVar79._0_4_))
                    goto LAB_01b71170;
                    auVar228._0_12_ = ZEXT812(0);
                    auVar228._12_4_ = 0;
                    auVar209._4_8_ = auVar228._4_8_;
                    auVar209._0_4_ = fVar180;
                    auVar209._12_4_ = 0;
                    auVar79 = vrsqrt14ss_avx512f(auVar228,auVar209);
                    fVar183 = auVar79._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar60].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01b71161;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar63 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01b71170;
                    fVar180 = fVar183 * 1.5 + fVar180 * -0.5 * fVar183 * fVar183 * fVar183;
                    auVar210._0_4_ = auVar17._0_4_ * fVar180;
                    auVar210._4_4_ = auVar17._4_4_ * fVar180;
                    auVar210._8_4_ = auVar17._8_4_ * fVar180;
                    auVar210._12_4_ = auVar17._12_4_ * fVar180;
                    auVar81 = vfmadd213ps_fma(auVar77,auVar210,auVar80);
                    auVar79 = vshufps_avx(auVar210,auVar210,0xc9);
                    auVar17 = vshufps_avx(auVar80,auVar80,0xc9);
                    auVar211._0_4_ = auVar210._0_4_ * auVar17._0_4_;
                    auVar211._4_4_ = auVar210._4_4_ * auVar17._4_4_;
                    auVar211._8_4_ = auVar210._8_4_ * auVar17._8_4_;
                    auVar211._12_4_ = auVar210._12_4_ * auVar17._12_4_;
                    auVar80 = vfmsub231ps_fma(auVar211,auVar80,auVar79);
                    auVar79 = vshufps_avx(auVar80,auVar80,0xc9);
                    auVar17 = vshufps_avx(auVar81,auVar81,0xc9);
                    auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                    auVar155._0_4_ = auVar81._0_4_ * auVar80._0_4_;
                    auVar155._4_4_ = auVar81._4_4_ * auVar80._4_4_;
                    auVar155._8_4_ = auVar81._8_4_ * auVar80._8_4_;
                    auVar155._12_4_ = auVar81._12_4_ * auVar80._12_4_;
                    auVar79 = vfmsub231ps_fma(auVar155,auVar79,auVar17);
                    auVar231._8_4_ = 1;
                    auVar231._0_8_ = 0x100000001;
                    auVar231._12_4_ = 1;
                    auVar231._16_4_ = 1;
                    auVar231._20_4_ = 1;
                    auVar231._24_4_ = 1;
                    auVar231._28_4_ = 1;
                    local_3a0 = vpermps_avx2(auVar231,ZEXT1632(auVar78));
                    auVar100 = vpermps_avx2(auVar231,ZEXT1632(auVar79));
                    auVar242._8_4_ = 2;
                    auVar242._0_8_ = 0x200000002;
                    auVar242._12_4_ = 2;
                    auVar242._16_4_ = 2;
                    auVar242._20_4_ = 2;
                    auVar242._24_4_ = 2;
                    auVar242._28_4_ = 2;
                    local_3e0 = vpermps_avx2(auVar242,ZEXT1632(auVar79));
                    local_3c0 = auVar79._0_4_;
                    local_400[0] = (RTCHitN)auVar100[0];
                    local_400[1] = (RTCHitN)auVar100[1];
                    local_400[2] = (RTCHitN)auVar100[2];
                    local_400[3] = (RTCHitN)auVar100[3];
                    local_400[4] = (RTCHitN)auVar100[4];
                    local_400[5] = (RTCHitN)auVar100[5];
                    local_400[6] = (RTCHitN)auVar100[6];
                    local_400[7] = (RTCHitN)auVar100[7];
                    local_400[8] = (RTCHitN)auVar100[8];
                    local_400[9] = (RTCHitN)auVar100[9];
                    local_400[10] = (RTCHitN)auVar100[10];
                    local_400[0xb] = (RTCHitN)auVar100[0xb];
                    local_400[0xc] = (RTCHitN)auVar100[0xc];
                    local_400[0xd] = (RTCHitN)auVar100[0xd];
                    local_400[0xe] = (RTCHitN)auVar100[0xe];
                    local_400[0xf] = (RTCHitN)auVar100[0xf];
                    local_400[0x10] = (RTCHitN)auVar100[0x10];
                    local_400[0x11] = (RTCHitN)auVar100[0x11];
                    local_400[0x12] = (RTCHitN)auVar100[0x12];
                    local_400[0x13] = (RTCHitN)auVar100[0x13];
                    local_400[0x14] = (RTCHitN)auVar100[0x14];
                    local_400[0x15] = (RTCHitN)auVar100[0x15];
                    local_400[0x16] = (RTCHitN)auVar100[0x16];
                    local_400[0x17] = (RTCHitN)auVar100[0x17];
                    local_400[0x18] = (RTCHitN)auVar100[0x18];
                    local_400[0x19] = (RTCHitN)auVar100[0x19];
                    local_400[0x1a] = (RTCHitN)auVar100[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar100[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar100[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar100[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar100[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar100[0x1f];
                    uStack_3bc = local_3c0;
                    uStack_3b8 = local_3c0;
                    uStack_3b4 = local_3c0;
                    uStack_3b0 = local_3c0;
                    uStack_3ac = local_3c0;
                    uStack_3a8 = local_3c0;
                    uStack_3a4 = local_3c0;
                    local_380 = ZEXT432(0) << 0x20;
                    local_360 = local_420._0_8_;
                    uStack_358 = local_420._8_8_;
                    uStack_350 = local_420._16_8_;
                    uStack_348 = local_420._24_8_;
                    local_340 = local_440;
                    vpcmpeqd_avx2(local_440,local_440);
                    local_320 = context->user->instID[0];
                    uStack_31c = local_320;
                    uStack_318 = local_320;
                    uStack_314 = local_320;
                    uStack_310 = local_320;
                    uStack_30c = local_320;
                    uStack_308 = local_320;
                    uStack_304 = local_320;
                    local_300 = context->user->instPrimID[0];
                    uStack_2fc = local_300;
                    uStack_2f8 = local_300;
                    uStack_2f4 = local_300;
                    uStack_2f0 = local_300;
                    uStack_2ec = local_300;
                    uStack_2e8 = local_300;
                    uStack_2e4 = local_300;
                    *(float *)(ray + k * 4 + 0x100) = fVar179;
                    local_740 = local_480;
                    local_810.valid = (int *)local_740;
                    local_810.geometryUserPtr = pGVar3->userPtr;
                    local_810.context = context->user;
                    local_810.hit = local_400;
                    local_810.N = 8;
                    local_810.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&local_810);
                      auVar273 = ZEXT3264(local_7e0);
                    }
                    if (local_740 != (undefined1  [32])0x0) {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var7)(&local_810);
                        auVar273 = ZEXT3264(local_7e0);
                      }
                      uVar69 = vptestmd_avx512vl(local_740,local_740);
                      auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar8 = (bool)((byte)uVar69 & 1);
                      bVar9 = (bool)((byte)(uVar69 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar69 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar69 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
                      bVar15 = SUB81(uVar69 >> 7,0);
                      *(uint *)(local_810.ray + 0x100) =
                           (uint)bVar8 * auVar100._0_4_ |
                           (uint)!bVar8 * *(int *)(local_810.ray + 0x100);
                      *(uint *)(local_810.ray + 0x104) =
                           (uint)bVar9 * auVar100._4_4_ |
                           (uint)!bVar9 * *(int *)(local_810.ray + 0x104);
                      *(uint *)(local_810.ray + 0x108) =
                           (uint)bVar10 * auVar100._8_4_ |
                           (uint)!bVar10 * *(int *)(local_810.ray + 0x108);
                      *(uint *)(local_810.ray + 0x10c) =
                           (uint)bVar11 * auVar100._12_4_ |
                           (uint)!bVar11 * *(int *)(local_810.ray + 0x10c);
                      *(uint *)(local_810.ray + 0x110) =
                           (uint)bVar12 * auVar100._16_4_ |
                           (uint)!bVar12 * *(int *)(local_810.ray + 0x110);
                      *(uint *)(local_810.ray + 0x114) =
                           (uint)bVar13 * auVar100._20_4_ |
                           (uint)!bVar13 * *(int *)(local_810.ray + 0x114);
                      *(uint *)(local_810.ray + 0x118) =
                           (uint)bVar14 * auVar100._24_4_ |
                           (uint)!bVar14 * *(int *)(local_810.ray + 0x118);
                      *(uint *)(local_810.ray + 0x11c) =
                           (uint)bVar15 * auVar100._28_4_ |
                           (uint)!bVar15 * *(int *)(local_810.ray + 0x11c);
                      bVar63 = 1;
                      if (local_740 != (undefined1  [32])0x0) goto LAB_01b71170;
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar181;
                  }
                  bVar63 = 0;
                  goto LAB_01b71170;
                }
              }
              bVar67 = uVar69 < 4;
              uVar69 = uVar69 + 1;
            } while (uVar69 != 5);
            bVar67 = false;
            bVar63 = 5;
LAB_01b71170:
            bVar64 = (bool)(bVar64 | bVar67 & bVar63);
            uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar160._4_4_ = uVar164;
            auVar160._0_4_ = uVar164;
            auVar160._8_4_ = uVar164;
            auVar160._12_4_ = uVar164;
            auVar160._16_4_ = uVar164;
            auVar160._20_4_ = uVar164;
            auVar160._24_4_ = uVar164;
            auVar160._28_4_ = uVar164;
            auVar53._4_4_ = fStack_4bc;
            auVar53._0_4_ = local_4c0;
            auVar53._8_4_ = fStack_4b8;
            auVar53._12_4_ = fStack_4b4;
            auVar53._16_4_ = fStack_4b0;
            auVar53._20_4_ = fStack_4ac;
            auVar53._24_4_ = fStack_4a8;
            auVar53._28_4_ = fStack_4a4;
            uVar21 = vcmpps_avx512vl(auVar160,auVar53,0xd);
            bVar58 = ~('\x01' << ((byte)iVar24 & 0x1f)) & bVar58 & (byte)uVar21;
            auVar135 = local_4e0;
          } while (bVar58 != 0);
        }
        auVar243 = ZEXT3264(local_6a0);
        uVar22 = vpcmpgtd_avx512vl(auVar135,local_460);
        uVar23 = vpcmpd_avx512vl(local_460,local_280,1);
        auVar214._0_4_ = fVar162 + (float)local_1c0._0_4_;
        auVar214._4_4_ = fVar162 + (float)local_1c0._4_4_;
        auVar214._8_4_ = fVar162 + fStack_1b8;
        auVar214._12_4_ = fVar162 + fStack_1b4;
        auVar214._16_4_ = fVar162 + fStack_1b0;
        auVar214._20_4_ = fVar162 + fStack_1ac;
        auVar214._24_4_ = fVar162 + fStack_1a8;
        auVar214._28_4_ = fVar162 + fStack_1a4;
        uVar21 = vcmpps_avx512vl(auVar214,auVar160,2);
        bVar59 = bVar59 & (byte)uVar23 & (byte)uVar21;
        auVar215._0_4_ = fVar162 + local_2e0._0_4_;
        auVar215._4_4_ = fVar162 + local_2e0._4_4_;
        auVar215._8_4_ = fVar162 + local_2e0._8_4_;
        auVar215._12_4_ = fVar162 + local_2e0._12_4_;
        auVar215._16_4_ = fVar162 + local_2e0._16_4_;
        auVar215._20_4_ = fVar162 + local_2e0._20_4_;
        auVar215._24_4_ = fVar162 + local_2e0._24_4_;
        auVar215._28_4_ = fVar162 + local_2e0._28_4_;
        uVar21 = vcmpps_avx512vl(auVar215,auVar160,2);
        bVar54 = bVar54 & (byte)uVar22 & (byte)uVar21 | bVar59;
        if (bVar54 != 0) {
          uVar57 = (ulong)uVar61;
          abStack_180[uVar57 * 0x60] = bVar54;
          bVar67 = (bool)(bVar59 >> 1 & 1);
          bVar8 = (bool)(bVar59 >> 2 & 1);
          bVar9 = (bool)(bVar59 >> 3 & 1);
          bVar10 = (bool)(bVar59 >> 4 & 1);
          bVar11 = (bool)(bVar59 >> 5 & 1);
          auStack_160[uVar57 * 0x18] =
               (uint)(bVar59 & 1) * local_1c0._0_4_ |
               (uint)!(bool)(bVar59 & 1) * (int)local_2e0._0_4_;
          auStack_160[uVar57 * 0x18 + 1] =
               (uint)bVar67 * local_1c0._4_4_ | (uint)!bVar67 * (int)local_2e0._4_4_;
          auStack_160[uVar57 * 0x18 + 2] =
               (uint)bVar8 * (int)fStack_1b8 | (uint)!bVar8 * (int)local_2e0._8_4_;
          auStack_160[uVar57 * 0x18 + 3] =
               (uint)bVar9 * (int)fStack_1b4 | (uint)!bVar9 * (int)local_2e0._12_4_;
          auStack_160[uVar57 * 0x18 + 4] =
               (uint)bVar10 * (int)fStack_1b0 | (uint)!bVar10 * (int)local_2e0._16_4_;
          auStack_160[uVar57 * 0x18 + 5] =
               (uint)bVar11 * (int)fStack_1ac | (uint)!bVar11 * (int)local_2e0._20_4_;
          auStack_160[uVar57 * 0x18 + 6] =
               (uint)(bVar59 >> 6) * (int)fStack_1a8 |
               (uint)!(bool)(bVar59 >> 6) * (int)local_2e0._24_4_;
          (&fStack_144)[uVar57 * 0x18] = local_2e0._28_4_;
          uVar69 = vmovlps_avx(local_490);
          (&uStack_140)[uVar57 * 0xc] = uVar69;
          aiStack_138[uVar57 * 0x18] = iVar62 + 1;
          uVar61 = uVar61 + 1;
        }
      }
    }
    do {
      uVar71 = uVar61;
      uVar70 = uVar71 - 1;
      if (uVar71 == 0) {
        if (bVar64 != false) {
          return bVar64;
        }
        uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar38._4_4_ = uVar164;
        auVar38._0_4_ = uVar164;
        auVar38._8_4_ = uVar164;
        auVar38._12_4_ = uVar164;
        uVar21 = vcmpps_avx512vl(local_4a0,auVar38,2);
        uVar60 = (uint)uVar21 & (uint)local_6a8 - 1 & (uint)local_6a8;
        local_6a8 = (ulong)uVar60;
        if (uVar60 == 0) {
          return false;
        }
        goto LAB_01b6ee20;
      }
      uVar69 = (ulong)uVar70;
      auVar100 = *(undefined1 (*) [32])(auStack_160 + uVar69 * 0x18);
      auVar175._0_4_ = fVar162 + auVar100._0_4_;
      auVar175._4_4_ = fVar162 + auVar100._4_4_;
      auVar175._8_4_ = fVar162 + auVar100._8_4_;
      auVar175._12_4_ = fVar162 + auVar100._12_4_;
      auVar175._16_4_ = fVar162 + auVar100._16_4_;
      auVar175._20_4_ = fVar162 + auVar100._20_4_;
      auVar175._24_4_ = fVar162 + auVar100._24_4_;
      auVar175._28_4_ = fVar162 + auVar100._28_4_;
      uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar41._4_4_ = uVar164;
      auVar41._0_4_ = uVar164;
      auVar41._8_4_ = uVar164;
      auVar41._12_4_ = uVar164;
      auVar41._16_4_ = uVar164;
      auVar41._20_4_ = uVar164;
      auVar41._24_4_ = uVar164;
      auVar41._28_4_ = uVar164;
      uVar21 = vcmpps_avx512vl(auVar175,auVar41,2);
      uVar137 = (uint)uVar21 & (uint)abStack_180[uVar69 * 0x60];
      uVar61 = uVar70;
    } while (uVar137 == 0);
    uVar57 = (&uStack_140)[uVar69 * 0xc];
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar57;
    auVar213._8_4_ = 0x7f800000;
    auVar213._0_8_ = 0x7f8000007f800000;
    auVar213._12_4_ = 0x7f800000;
    auVar213._16_4_ = 0x7f800000;
    auVar213._20_4_ = 0x7f800000;
    auVar213._24_4_ = 0x7f800000;
    auVar213._28_4_ = 0x7f800000;
    auVar102 = vblendmps_avx512vl(auVar213,auVar100);
    bVar54 = (byte)uVar137;
    auVar133._0_4_ =
         (uint)(bVar54 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar54 & 1) * (int)auVar100._0_4_;
    bVar67 = (bool)((byte)(uVar137 >> 1) & 1);
    auVar133._4_4_ = (uint)bVar67 * auVar102._4_4_ | (uint)!bVar67 * (int)auVar100._4_4_;
    bVar67 = (bool)((byte)(uVar137 >> 2) & 1);
    auVar133._8_4_ = (uint)bVar67 * auVar102._8_4_ | (uint)!bVar67 * (int)auVar100._8_4_;
    bVar67 = (bool)((byte)(uVar137 >> 3) & 1);
    auVar133._12_4_ = (uint)bVar67 * auVar102._12_4_ | (uint)!bVar67 * (int)auVar100._12_4_;
    bVar67 = (bool)((byte)(uVar137 >> 4) & 1);
    auVar133._16_4_ = (uint)bVar67 * auVar102._16_4_ | (uint)!bVar67 * (int)auVar100._16_4_;
    bVar67 = (bool)((byte)(uVar137 >> 5) & 1);
    auVar133._20_4_ = (uint)bVar67 * auVar102._20_4_ | (uint)!bVar67 * (int)auVar100._20_4_;
    bVar67 = (bool)((byte)(uVar137 >> 6) & 1);
    auVar133._24_4_ = (uint)bVar67 * auVar102._24_4_ | (uint)!bVar67 * (int)auVar100._24_4_;
    auVar133._28_4_ =
         (uVar137 >> 7) * auVar102._28_4_ | (uint)!SUB41(uVar137 >> 7,0) * (int)auVar100._28_4_;
    auVar100 = vshufps_avx(auVar133,auVar133,0xb1);
    auVar100 = vminps_avx(auVar133,auVar100);
    auVar102 = vshufpd_avx(auVar100,auVar100,5);
    auVar100 = vminps_avx(auVar100,auVar102);
    auVar102 = vpermpd_avx2(auVar100,0x4e);
    auVar100 = vminps_avx(auVar100,auVar102);
    uVar21 = vcmpps_avx512vl(auVar133,auVar100,0);
    bVar58 = (byte)uVar21 & bVar54;
    if (bVar58 != 0) {
      uVar137 = (uint)bVar58;
    }
    uVar138 = 0;
    for (; (uVar137 & 1) == 0; uVar137 = uVar137 >> 1 | 0x80000000) {
      uVar138 = uVar138 + 1;
    }
    iVar62 = aiStack_138[uVar69 * 0x18];
    bVar54 = ~('\x01' << ((byte)uVar138 & 0x1f)) & bVar54;
    abStack_180[uVar69 * 0x60] = bVar54;
    uVar61 = uVar71;
    if (bVar54 == 0) {
      uVar61 = uVar70;
    }
    uVar164 = (undefined4)uVar57;
    auVar157._4_4_ = uVar164;
    auVar157._0_4_ = uVar164;
    auVar157._8_4_ = uVar164;
    auVar157._12_4_ = uVar164;
    auVar157._16_4_ = uVar164;
    auVar157._20_4_ = uVar164;
    auVar157._24_4_ = uVar164;
    auVar157._28_4_ = uVar164;
    auVar78 = vmovshdup_avx(auVar168);
    auVar78 = vsubps_avx(auVar78,auVar168);
    auVar176._0_4_ = auVar78._0_4_;
    auVar176._4_4_ = auVar176._0_4_;
    auVar176._8_4_ = auVar176._0_4_;
    auVar176._12_4_ = auVar176._0_4_;
    auVar176._16_4_ = auVar176._0_4_;
    auVar176._20_4_ = auVar176._0_4_;
    auVar176._24_4_ = auVar176._0_4_;
    auVar176._28_4_ = auVar176._0_4_;
    auVar78 = vfmadd132ps_fma(auVar176,auVar157,_DAT_01faff20);
    auVar100 = ZEXT1632(auVar78);
    local_400[0] = (RTCHitN)auVar100[0];
    local_400[1] = (RTCHitN)auVar100[1];
    local_400[2] = (RTCHitN)auVar100[2];
    local_400[3] = (RTCHitN)auVar100[3];
    local_400[4] = (RTCHitN)auVar100[4];
    local_400[5] = (RTCHitN)auVar100[5];
    local_400[6] = (RTCHitN)auVar100[6];
    local_400[7] = (RTCHitN)auVar100[7];
    local_400[8] = (RTCHitN)auVar100[8];
    local_400[9] = (RTCHitN)auVar100[9];
    local_400[10] = (RTCHitN)auVar100[10];
    local_400[0xb] = (RTCHitN)auVar100[0xb];
    local_400[0xc] = (RTCHitN)auVar100[0xc];
    local_400[0xd] = (RTCHitN)auVar100[0xd];
    local_400[0xe] = (RTCHitN)auVar100[0xe];
    local_400[0xf] = (RTCHitN)auVar100[0xf];
    local_400[0x10] = (RTCHitN)auVar100[0x10];
    local_400[0x11] = (RTCHitN)auVar100[0x11];
    local_400[0x12] = (RTCHitN)auVar100[0x12];
    local_400[0x13] = (RTCHitN)auVar100[0x13];
    local_400[0x14] = (RTCHitN)auVar100[0x14];
    local_400[0x15] = (RTCHitN)auVar100[0x15];
    local_400[0x16] = (RTCHitN)auVar100[0x16];
    local_400[0x17] = (RTCHitN)auVar100[0x17];
    local_400[0x18] = (RTCHitN)auVar100[0x18];
    local_400[0x19] = (RTCHitN)auVar100[0x19];
    local_400[0x1a] = (RTCHitN)auVar100[0x1a];
    local_400[0x1b] = (RTCHitN)auVar100[0x1b];
    local_400[0x1c] = (RTCHitN)auVar100[0x1c];
    local_400[0x1d] = (RTCHitN)auVar100[0x1d];
    local_400[0x1e] = (RTCHitN)auVar100[0x1e];
    local_400[0x1f] = (RTCHitN)auVar100[0x1f];
    local_490._8_8_ = 0;
    local_490._0_8_ = *(ulong *)(local_400 + (ulong)uVar138 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }